

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O1

void run_schnorrsig_tests(void)

{
  uint32_t uVar1;
  int iVar2;
  uint32_t uVar3;
  uint uVar4;
  size_t in_RCX;
  long lVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  secp256k1_context *psVar9;
  ulong uVar10;
  size_t in_R8;
  uchar *puVar11;
  uchar *sig64;
  ulong uVar12;
  byte bVar13;
  secp256k1_xonly_pubkey *pubkey;
  uchar aux_rand [32];
  uchar algo [13];
  uchar nonce_z [32];
  uchar *args [5];
  uchar key [32];
  uchar pk [32];
  uchar msg [32];
  uchar nonce [32];
  secp256k1_xonly_pubkey pk_1 [3];
  secp256k1_sha256 sha;
  secp256k1_schnorrsig_extraparams invalid_extraparams;
  int local_3dc;
  secp256k1_schnorrsig_extraparams local_3d8;
  undefined8 uStack_3c0;
  secp256k1_schnorrsig_extraparams local_3b8;
  secp256k1_xonly_pubkey local_398;
  undefined1 local_358 [8];
  secp256k1_scalar *psStack_350;
  uchar *local_348;
  secp256k1_schnorrsig_extraparams *psStack_340;
  secp256k1_schnorrsig_extraparams *local_338;
  uchar auStack_330 [56];
  secp256k1_scalar local_2f8;
  uchar local_2d8 [32];
  uchar local_2b8 [40];
  ulong local_290;
  secp256k1_keypair local_288;
  undefined1 local_228 [96];
  uint64_t local_1c8;
  secp256k1_xonly_pubkey local_1a8;
  undefined1 local_168 [192];
  secp256k1_keypair local_a8;
  secp256k1_schnorrsig_extraparams local_48;
  
  local_3b8.noncefp._0_5_ = 0x65636e6f6e;
  builtin_memcpy(local_3b8.magic,"BIP0",4);
  local_3b8._4_4_ = 0x2f303433;
  secp256k1_sha256_initialize_tagged((secp256k1_sha256 *)local_168,"BIP0340/nonce",0xd);
  local_228[0] = '5';
  local_228[1] = '[';
  local_228[2] = 'a';
  local_228[3] = 'F';
  local_228[4] = 0xf7;
  local_228[5] = 0xbf;
  local_228[6] = 0xbf;
  local_228[7] = 0xf4;
  local_228[8] = 'q';
  local_228[9] = 0xc6;
  local_228[10] = 0x8d;
  local_228[0xb] = 0x9f;
  local_228[0xc] = 0xb3;
  local_228[0xd] = 'z';
  local_228[0xe] = 'b';
  local_228[0xf] = 0x83;
  local_228[0x10] = 0x80;
  local_228[0x11] = 'q';
  local_228[0x12] = '!';
  local_228[0x13] = '`';
  local_228[0x14] = 'a';
  local_228[0x15] = 0x86;
  local_228[0x16] = '5';
  local_228[0x17] = 'W';
  local_228[0x18] = 'T';
  local_228[0x19] = 0x9e;
  local_228[0x1a] = 0xa2;
  local_228[0x1b] = '!';
  local_228[0x1c] = 'L';
  local_228[0x1d] = '{';
  local_228[0x1e] = 0xb0;
  local_228[0x1f] = 'h';
  local_1c8 = 0x40;
  test_sha256_eq((secp256k1_sha256 *)local_168,(secp256k1_sha256 *)local_228);
  secp256k1_sha256_initialize_tagged((secp256k1_sha256 *)local_168,"BIP0340/auxBIP0340/nonce",0xb);
  local_228[0] = '\x19';
  local_228[1] = '2';
  local_228[2] = 0xdd;
  local_228[3] = '$';
  local_228[4] = 'p';
  local_228[5] = '~';
  local_228[6] = 0xba;
  local_228[7] = 'N';
  local_228[8] = 0xb9;
  local_228[9] = 0xab;
  local_228[10] = '\x0f';
  local_228[0xb] = 0xca;
  local_228[0xc] = 'm';
  local_228[0xd] = '\x16';
  local_228[0xe] = 0xa3;
  local_228[0xf] = '\x0f';
  local_228[0x10] = 0xb1;
  local_228[0x11] = 0xe4;
  local_228[0x12] = 0xfb;
  local_228[0x13] = ':';
  local_228[0x14] = 0x97;
  local_228[0x15] = 0xdf;
  local_228[0x16] = 'D';
  local_228[0x17] = 'L';
  local_228[0x18] = '9';
  local_228[0x19] = '\'';
  local_228[0x1a] = 0xac;
  local_228[0x1b] = 'J';
  local_228[0x1c] = '\n';
  local_228[0x1d] = 0x85;
  local_228[0x1e] = 0x9e;
  local_228[0x1f] = '$';
  local_1c8 = 0x40;
  test_sha256_eq((secp256k1_sha256 *)local_168,(secp256k1_sha256 *)local_228);
  secp256k1_testrand256(local_2b8);
  secp256k1_testrand256((uchar *)&local_2f8);
  secp256k1_testrand256(local_2d8);
  secp256k1_testrand256(local_3d8.magic);
  local_358 = (undefined1  [8])local_2b8;
  psStack_350 = &local_2f8;
  local_348 = local_2d8;
  psStack_340 = &local_3b8;
  local_338 = &local_3d8;
  if (0 < COUNT) {
    iVar7 = 0;
    do {
      nonce_function_bip340_bitflip((uchar **)local_358,0,0x20,in_RCX,in_R8);
      nonce_function_bip340_bitflip((uchar **)local_358,1,0x20,in_RCX,in_R8);
      nonce_function_bip340_bitflip((uchar **)local_358,2,0x20,in_RCX,in_R8);
      nonce_function_bip340_bitflip((uchar **)local_358,3,0xd,in_RCX,in_R8);
      nonce_function_bip340_bitflip((uchar **)local_358,3,0xd,in_RCX,in_R8);
      nonce_function_bip340_bitflip((uchar **)local_358,4,0x20,in_RCX,in_R8);
      iVar7 = iVar7 + 1;
    } while (iVar7 < COUNT);
  }
  iVar7 = nonce_function_bip340
                    (local_288.data,local_2b8,0x20,(uchar *)&local_2f8,local_2d8,local_3b8.magic,0xd
                     ,(void *)0x0);
  if (iVar7 == 0) goto LAB_00144f4f;
  secp256k1_testrand_bytes_test(local_3b8.magic,0xd);
  iVar7 = nonce_function_bip340
                    (local_288.data,local_2b8,0x20,(uchar *)&local_2f8,local_2d8,local_3b8.magic,0xd
                     ,(void *)0x0);
  if (iVar7 == 0) goto LAB_00144f54;
  if (0 < COUNT) {
    iVar7 = 0;
    do {
      uVar1 = secp256k1_testrand_int(0x1f);
      iVar2 = nonce_function_bip340
                        (local_398.data,local_2b8,(ulong)(uVar1 & 0x1f),(uchar *)&local_2f8,
                         local_2d8,local_3b8.magic,0xd,(void *)0x0);
      if (iVar2 == 0) goto LAB_00144e91;
      lVar5 = 0;
      do {
        iVar2 = (uint)local_288.data[lVar5] - (uint)local_398.data[lVar5];
        if (local_288.data[lVar5] != local_398.data[lVar5]) goto LAB_00142dc5;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x20);
      iVar2 = 0;
LAB_00142dc5:
      if (iVar2 == 0) goto LAB_00144e96;
      uVar1 = secp256k1_testrand_int(0xc);
      iVar2 = nonce_function_bip340
                        (local_398.data,local_2b8,0x20,(uchar *)&local_2f8,local_2d8,local_3b8.magic
                         ,((ulong)uVar1 + 0xd) % 0xd,(void *)0x0);
      if (iVar2 == 0) goto LAB_00144e9b;
      lVar5 = 0;
      do {
        iVar2 = (uint)local_288.data[lVar5] - (uint)local_398.data[lVar5];
        if (local_288.data[lVar5] != local_398.data[lVar5]) goto LAB_00142e4e;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x20);
      iVar2 = 0;
LAB_00142e4e:
      if (iVar2 == 0) goto LAB_00144ea0;
      iVar7 = iVar7 + 1;
    } while (iVar7 < COUNT);
  }
  local_3d8.ndata = (uchar *)0x0;
  uStack_3c0 = 0;
  local_3d8.magic[0] = '\0';
  local_3d8.magic[1] = '\0';
  local_3d8.magic[2] = '\0';
  local_3d8.magic[3] = '\0';
  local_3d8._4_4_ = 0;
  local_3d8.noncefp = (secp256k1_nonce_function_hardened)0x0;
  iVar7 = nonce_function_bip340
                    (local_398.data,local_2b8,0x20,(uchar *)&local_2f8,local_2d8,local_3b8.magic,0xd
                     ,&local_3d8);
  if (iVar7 == 0) goto LAB_00144f59;
  iVar7 = nonce_function_bip340
                    (local_288.data,local_2b8,0x20,(uchar *)&local_2f8,local_2d8,local_3b8.magic,0xd
                     ,(void *)0x0);
  psVar9 = CTX;
  if (iVar7 == 0) goto LAB_00144f5e;
  lVar5 = 0;
  do {
    iVar7 = (uint)local_398.data[lVar5] - (uint)local_288.data[lVar5];
    if (local_398.data[lVar5] != local_288.data[lVar5]) goto LAB_00142f27;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x20);
  iVar7 = 0;
LAB_00142f27:
  if (iVar7 != 0) goto LAB_00144f63;
  auStack_330[0x28] = '\0';
  auStack_330[0x29] = '\0';
  auStack_330[0x2a] = '\0';
  auStack_330[0x2b] = '\0';
  auStack_330[0x2c] = '\0';
  auStack_330[0x2d] = '\0';
  auStack_330[0x2e] = '\0';
  auStack_330[0x2f] = '\0';
  auStack_330[0x30] = '\0';
  auStack_330[0x31] = '\0';
  auStack_330[0x32] = '\0';
  auStack_330[0x33] = '\0';
  auStack_330[0x34] = '\0';
  auStack_330[0x35] = '\0';
  auStack_330[0x36] = '\0';
  auStack_330[0x37] = '\0';
  auStack_330[0x18] = '\0';
  auStack_330[0x19] = '\0';
  auStack_330[0x1a] = '\0';
  auStack_330[0x1b] = '\0';
  auStack_330[0x1c] = '\0';
  auStack_330[0x1d] = '\0';
  auStack_330[0x1e] = '\0';
  auStack_330[0x1f] = '\0';
  auStack_330[0x20] = '\0';
  auStack_330[0x21] = '\0';
  auStack_330[0x22] = '\0';
  auStack_330[0x23] = '\0';
  auStack_330[0x24] = '\0';
  auStack_330[0x25] = '\0';
  auStack_330[0x26] = '\0';
  auStack_330[0x27] = '\0';
  auStack_330[8] = '\0';
  auStack_330[9] = '\0';
  auStack_330[10] = '\0';
  auStack_330[0xb] = '\0';
  auStack_330[0xc] = '\0';
  auStack_330[0xd] = '\0';
  auStack_330[0xe] = '\0';
  auStack_330[0xf] = '\0';
  auStack_330[0x10] = '\0';
  auStack_330[0x11] = '\0';
  auStack_330[0x12] = '\0';
  auStack_330[0x13] = '\0';
  auStack_330[0x14] = '\0';
  auStack_330[0x15] = '\0';
  auStack_330[0x16] = '\0';
  auStack_330[0x17] = '\0';
  local_338 = (secp256k1_schnorrsig_extraparams *)0x0;
  auStack_330[0] = '\0';
  auStack_330[1] = '\0';
  auStack_330[2] = '\0';
  auStack_330[3] = '\0';
  auStack_330[4] = '\0';
  auStack_330[5] = '\0';
  auStack_330[6] = '\0';
  auStack_330[7] = '\0';
  local_348 = (uchar *)0x0;
  psStack_340 = (secp256k1_schnorrsig_extraparams *)0x0;
  local_358 = (undefined1  [8])0x0;
  psStack_350 = (secp256k1_scalar *)0x0;
  local_3b8.ndata = (void *)0x0;
  local_3b8.magic[0] = 0xda;
  local_3b8.magic[1] = 'o';
  local_3b8.magic[2] = 0xb3;
  local_3b8.magic[3] = 0x8c;
  local_3b8._4_4_ = 0;
  local_3b8.noncefp._0_5_ = 0;
  local_3b8.noncefp._5_3_ = 0;
  local_48.magic[0] = '\0';
  local_48.magic[1] = '\0';
  local_48.magic[2] = '\0';
  local_48.magic[3] = '\0';
  local_48._4_4_ = 0;
  local_48.noncefp = (secp256k1_nonce_function_hardened)0x0;
  local_48.ndata = (void *)0x0;
  local_3dc = 0;
  if (secp256k1_context_static == CTX) goto LAB_00144f68;
  (CTX->error_callback).fn = counting_illegal_callback_fn;
  (psVar9->error_callback).data = &local_3dc;
  do {
    psVar9 = CTX;
    if (secp256k1_context_static == CTX) {
      (*(CTX->illegal_callback).fn)("ctx != secp256k1_context_static",(CTX->illegal_callback).data);
    }
    else {
      (CTX->illegal_callback).fn = counting_illegal_callback_fn;
      (psVar9->illegal_callback).data = &local_3dc;
    }
    psVar9 = STATIC_CTX;
    if (secp256k1_context_static == STATIC_CTX) {
      run_schnorrsig_tests_cold_3();
    }
    else {
      (STATIC_CTX->error_callback).fn = counting_illegal_callback_fn;
      (psVar9->error_callback).data = &local_3dc;
    }
    psVar9 = STATIC_CTX;
    if (secp256k1_context_static == STATIC_CTX) {
      (*(STATIC_CTX->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(STATIC_CTX->illegal_callback).data);
    }
    else {
      (STATIC_CTX->illegal_callback).fn = counting_illegal_callback_fn;
      (psVar9->illegal_callback).data = &local_3dc;
    }
    secp256k1_testrand256(local_2b8);
    secp256k1_testrand256((uchar *)&local_2f8);
    secp256k1_testrand256(local_2d8);
    secp256k1_testrand256(local_3d8.magic);
    iVar7 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)local_168,local_2b8);
    if (iVar7 == 0) {
      run_schnorrsig_tests_cold_103();
LAB_00144fb3:
      run_schnorrsig_tests_cold_102();
LAB_00144fb8:
      run_schnorrsig_tests_cold_101();
LAB_00144fbd:
      run_schnorrsig_tests_cold_100();
LAB_00144fc2:
      run_schnorrsig_tests_cold_99();
LAB_00144fc7:
      run_schnorrsig_tests_cold_98();
LAB_00144fcc:
      run_schnorrsig_tests_cold_97();
LAB_00144fd1:
      run_schnorrsig_tests_cold_4();
LAB_00144fd6:
      run_schnorrsig_tests_cold_5();
LAB_00144fdb:
      run_schnorrsig_tests_cold_6();
LAB_00144fe0:
      run_schnorrsig_tests_cold_7();
LAB_00144fe5:
      run_schnorrsig_tests_cold_8();
LAB_00144fea:
      run_schnorrsig_tests_cold_9();
LAB_00144fef:
      run_schnorrsig_tests_cold_10();
LAB_00144ff4:
      run_schnorrsig_tests_cold_11();
LAB_00144ff9:
      run_schnorrsig_tests_cold_12();
LAB_00144ffe:
      run_schnorrsig_tests_cold_13();
LAB_00145003:
      run_schnorrsig_tests_cold_14();
LAB_00145008:
      run_schnorrsig_tests_cold_96();
LAB_0014500d:
      run_schnorrsig_tests_cold_15();
LAB_00145012:
      run_schnorrsig_tests_cold_16();
LAB_00145017:
      run_schnorrsig_tests_cold_17();
LAB_0014501c:
      run_schnorrsig_tests_cold_18();
LAB_00145021:
      run_schnorrsig_tests_cold_19();
LAB_00145026:
      run_schnorrsig_tests_cold_95();
LAB_0014502b:
      run_schnorrsig_tests_cold_20();
LAB_00145030:
      run_schnorrsig_tests_cold_21();
LAB_00145035:
      run_schnorrsig_tests_cold_22();
LAB_0014503a:
      run_schnorrsig_tests_cold_23();
LAB_0014503f:
      run_schnorrsig_tests_cold_24();
LAB_00145044:
      run_schnorrsig_tests_cold_94();
LAB_00145049:
      run_schnorrsig_tests_cold_25();
LAB_0014504e:
      run_schnorrsig_tests_cold_26();
LAB_00145053:
      run_schnorrsig_tests_cold_27();
LAB_00145058:
      run_schnorrsig_tests_cold_28();
LAB_0014505d:
      run_schnorrsig_tests_cold_29();
LAB_00145062:
      run_schnorrsig_tests_cold_93();
LAB_00145067:
      run_schnorrsig_tests_cold_92();
LAB_0014506c:
      run_schnorrsig_tests_cold_30();
LAB_00145071:
      run_schnorrsig_tests_cold_31();
LAB_00145076:
      run_schnorrsig_tests_cold_32();
LAB_0014507b:
      run_schnorrsig_tests_cold_33();
LAB_00145080:
      run_schnorrsig_tests_cold_34();
LAB_00145085:
      run_schnorrsig_tests_cold_35();
LAB_0014508a:
      run_schnorrsig_tests_cold_36();
LAB_0014508f:
      run_schnorrsig_tests_cold_37();
LAB_00145094:
      run_schnorrsig_tests_cold_38();
LAB_00145099:
      run_schnorrsig_tests_cold_39();
LAB_0014509e:
      run_schnorrsig_tests_cold_40();
LAB_001450a3:
      run_schnorrsig_tests_cold_41();
    }
    else {
      iVar7 = secp256k1_keypair_create
                        (CTX,(secp256k1_keypair *)(local_168 + 0x60),(uchar *)&local_2f8);
      if (iVar7 == 0) goto LAB_00144fb3;
      iVar7 = secp256k1_keypair_create(CTX,&local_a8,local_2d8);
      if (iVar7 == 0) goto LAB_00144fb8;
      iVar7 = secp256k1_keypair_xonly_pub
                        (CTX,(secp256k1_xonly_pubkey *)local_228,(int *)0x0,
                         (secp256k1_keypair *)local_168);
      if (iVar7 == 0) goto LAB_00144fbd;
      iVar7 = secp256k1_keypair_xonly_pub
                        (CTX,(secp256k1_xonly_pubkey *)(local_228 + 0x40),(int *)0x0,
                         (secp256k1_keypair *)(local_168 + 0x60));
      if (iVar7 == 0) goto LAB_00144fc2;
      iVar7 = secp256k1_keypair_xonly_pub(CTX,&local_1a8,(int *)0x0,&local_a8);
      if (iVar7 == 0) goto LAB_00144fc7;
      local_288.data[0x30] = '\0';
      local_288.data[0x31] = '\0';
      local_288.data[0x32] = '\0';
      local_288.data[0x33] = '\0';
      local_288.data[0x34] = '\0';
      local_288.data[0x35] = '\0';
      local_288.data[0x36] = '\0';
      local_288.data[0x37] = '\0';
      local_288.data[0x38] = '\0';
      local_288.data[0x39] = '\0';
      local_288.data[0x3a] = '\0';
      local_288.data[0x3b] = '\0';
      local_288.data[0x3c] = '\0';
      local_288.data[0x3d] = '\0';
      local_288.data[0x3e] = '\0';
      local_288.data[0x3f] = '\0';
      local_288.data[0x20] = '\0';
      local_288.data[0x21] = '\0';
      local_288.data[0x22] = '\0';
      local_288.data[0x23] = '\0';
      local_288.data[0x24] = '\0';
      local_288.data[0x25] = '\0';
      local_288.data[0x26] = '\0';
      local_288.data[0x27] = '\0';
      local_288.data[0x28] = '\0';
      local_288.data[0x29] = '\0';
      local_288.data[0x2a] = '\0';
      local_288.data[0x2b] = '\0';
      local_288.data[0x2c] = '\0';
      local_288.data[0x2d] = '\0';
      local_288.data[0x2e] = '\0';
      local_288.data[0x2f] = '\0';
      local_288.data[0x10] = '\0';
      local_288.data[0x11] = '\0';
      local_288.data[0x12] = '\0';
      local_288.data[0x13] = '\0';
      local_288.data[0x14] = '\0';
      local_288.data[0x15] = '\0';
      local_288.data[0x16] = '\0';
      local_288.data[0x17] = '\0';
      local_288.data[0x18] = '\0';
      local_288.data[0x19] = '\0';
      local_288.data[0x1a] = '\0';
      local_288.data[0x1b] = '\0';
      local_288.data[0x1c] = '\0';
      local_288.data[0x1d] = '\0';
      local_288.data[0x1e] = '\0';
      local_288.data[0x1f] = '\0';
      local_288.data[0] = '\0';
      local_288.data[1] = '\0';
      local_288.data[2] = '\0';
      local_288.data[3] = '\0';
      local_288.data[4] = '\0';
      local_288.data[5] = '\0';
      local_288.data[6] = '\0';
      local_288.data[7] = '\0';
      local_288.data[8] = '\0';
      local_288.data[9] = '\0';
      local_288.data[10] = '\0';
      local_288.data[0xb] = '\0';
      local_288.data[0xc] = '\0';
      local_288.data[0xd] = '\0';
      local_288.data[0xe] = '\0';
      local_288.data[0xf] = '\0';
      local_3dc = 0;
      iVar7 = secp256k1_schnorrsig_sign_internal
                        (CTX,local_398.data,local_3d8.magic,0x20,(secp256k1_keypair *)local_168,
                         nonce_function_bip340,(void *)0x0);
      if (iVar7 == 0) goto LAB_00144fcc;
      if (local_3dc != 0) goto LAB_00144fd1;
      iVar7 = secp256k1_schnorrsig_sign_internal
                        (CTX,(uchar *)0x0,local_3d8.magic,0x20,(secp256k1_keypair *)local_168,
                         nonce_function_bip340,(void *)0x0);
      if (iVar7 != 0) goto LAB_00144fd6;
      if (local_3dc != 1) goto LAB_00144fdb;
      iVar7 = secp256k1_schnorrsig_sign_internal
                        (CTX,local_398.data,(uchar *)0x0,0x20,(secp256k1_keypair *)local_168,
                         nonce_function_bip340,(void *)0x0);
      if (iVar7 != 0) goto LAB_00144fe0;
      if (local_3dc != 2) goto LAB_00144fe5;
      iVar7 = secp256k1_schnorrsig_sign_internal
                        (CTX,local_398.data,local_3d8.magic,0x20,(secp256k1_keypair *)0x0,
                         nonce_function_bip340,(void *)0x0);
      if (iVar7 != 0) goto LAB_00144fea;
      if (local_3dc != 3) goto LAB_00144fef;
      iVar7 = secp256k1_schnorrsig_sign_internal
                        (CTX,local_398.data,local_3d8.magic,0x20,(secp256k1_keypair *)local_358,
                         nonce_function_bip340,(void *)0x0);
      if (iVar7 != 0) goto LAB_00144ff4;
      if (local_3dc != 4) goto LAB_00144ff9;
      iVar7 = secp256k1_schnorrsig_sign_internal
                        (STATIC_CTX,local_398.data,local_3d8.magic,0x20,
                         (secp256k1_keypair *)local_168,nonce_function_bip340,(void *)0x0);
      if (iVar7 != 0) goto LAB_00144ffe;
      if (local_3dc != 5) goto LAB_00145003;
      local_3dc = 0;
      iVar7 = secp256k1_schnorrsig_sign_custom
                        (CTX,local_398.data,local_3d8.magic,0x20,(secp256k1_keypair *)local_168,
                         &local_3b8);
      if (iVar7 == 0) goto LAB_00145008;
      if (local_3dc != 0) goto LAB_0014500d;
      iVar7 = secp256k1_schnorrsig_sign_custom
                        (CTX,(uchar *)0x0,local_3d8.magic,0x20,(secp256k1_keypair *)local_168,
                         &local_3b8);
      if (iVar7 != 0) goto LAB_00145012;
      if (local_3dc != 1) goto LAB_00145017;
      iVar7 = secp256k1_schnorrsig_sign_custom
                        (CTX,local_398.data,(uchar *)0x0,0x20,(secp256k1_keypair *)local_168,
                         &local_3b8);
      if (iVar7 != 0) goto LAB_0014501c;
      if (local_3dc != 2) goto LAB_00145021;
      iVar7 = secp256k1_schnorrsig_sign_custom
                        (CTX,local_398.data,(uchar *)0x0,0,(secp256k1_keypair *)local_168,&local_3b8
                        );
      if (iVar7 == 0) goto LAB_00145026;
      if (local_3dc != 2) goto LAB_0014502b;
      iVar7 = secp256k1_schnorrsig_sign_custom
                        (CTX,local_398.data,local_3d8.magic,0x20,(secp256k1_keypair *)0x0,&local_3b8
                        );
      if (iVar7 != 0) goto LAB_00145030;
      if (local_3dc != 3) goto LAB_00145035;
      iVar7 = secp256k1_schnorrsig_sign_custom
                        (CTX,local_398.data,local_3d8.magic,0x20,(secp256k1_keypair *)local_358,
                         &local_3b8);
      if (iVar7 != 0) goto LAB_0014503a;
      if (local_3dc != 4) goto LAB_0014503f;
      iVar7 = secp256k1_schnorrsig_sign_custom
                        (CTX,local_398.data,local_3d8.magic,0x20,(secp256k1_keypair *)local_168,
                         (secp256k1_schnorrsig_extraparams *)0x0);
      if (iVar7 == 0) goto LAB_00145044;
      if (local_3dc != 4) goto LAB_00145049;
      iVar7 = secp256k1_schnorrsig_sign_custom
                        (CTX,local_398.data,local_3d8.magic,0x20,(secp256k1_keypair *)local_168,
                         &local_48);
      if (iVar7 != 0) goto LAB_0014504e;
      if (local_3dc != 5) goto LAB_00145053;
      iVar7 = secp256k1_schnorrsig_sign_custom
                        (STATIC_CTX,local_398.data,local_3d8.magic,0x20,
                         (secp256k1_keypair *)local_168,&local_3b8);
      if (iVar7 != 0) goto LAB_00145058;
      if (local_3dc != 6) goto LAB_0014505d;
      local_3dc = 0;
      iVar7 = secp256k1_schnorrsig_sign_internal
                        (CTX,local_398.data,local_3d8.magic,0x20,(secp256k1_keypair *)local_168,
                         nonce_function_bip340,(void *)0x0);
      if (iVar7 == 0) goto LAB_00145062;
      iVar7 = secp256k1_schnorrsig_verify
                        (CTX,local_398.data,local_3d8.magic,0x20,(secp256k1_xonly_pubkey *)local_228
                        );
      if (iVar7 == 0) goto LAB_00145067;
      if (local_3dc != 0) goto LAB_0014506c;
      iVar7 = secp256k1_schnorrsig_verify
                        (CTX,(uchar *)0x0,local_3d8.magic,0x20,(secp256k1_xonly_pubkey *)local_228);
      if (iVar7 != 0) goto LAB_00145071;
      if (local_3dc != 1) goto LAB_00145076;
      iVar7 = secp256k1_schnorrsig_verify
                        (CTX,local_398.data,(uchar *)0x0,0x20,(secp256k1_xonly_pubkey *)local_228);
      if (iVar7 != 0) goto LAB_0014507b;
      if (local_3dc != 2) goto LAB_00145080;
      iVar7 = secp256k1_schnorrsig_verify
                        (CTX,local_398.data,(uchar *)0x0,0,(secp256k1_xonly_pubkey *)local_228);
      if (iVar7 != 0) goto LAB_00145085;
      if (local_3dc != 2) goto LAB_0014508a;
      iVar7 = secp256k1_schnorrsig_verify
                        (CTX,local_398.data,local_3d8.magic,0x20,(secp256k1_xonly_pubkey *)0x0);
      if (iVar7 != 0) goto LAB_0014508f;
      if (local_3dc != 3) goto LAB_00145094;
      iVar7 = secp256k1_schnorrsig_verify
                        (CTX,local_398.data,local_3d8.magic,0x20,
                         (secp256k1_xonly_pubkey *)&local_288);
      psVar9 = STATIC_CTX;
      if (iVar7 != 0) goto LAB_00145099;
      if (local_3dc != 4) goto LAB_0014509e;
      if (secp256k1_context_static == STATIC_CTX) goto LAB_001450a3;
      (STATIC_CTX->error_callback).fn = secp256k1_default_error_callback_fn;
      (psVar9->error_callback).data = (void *)0x0;
    }
    psVar9 = STATIC_CTX;
    if (secp256k1_context_static == STATIC_CTX) {
      (*(STATIC_CTX->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(STATIC_CTX->illegal_callback).data);
    }
    else {
      (STATIC_CTX->illegal_callback).fn = secp256k1_default_illegal_callback_fn;
      (psVar9->illegal_callback).data = (void *)0x0;
    }
    secp256k1_sha256_initialize_tagged
              ((secp256k1_sha256 *)local_168,(uchar *)"BIP0340/challenge",0x11);
    local_228[0] = '\x11';
    local_228[1] = 0xba;
    local_228[2] = 0xec;
    local_228[3] = 0x9c;
    local_228[4] = 0x81;
    local_228[5] = 'S';
    local_228[6] = 0x92;
    local_228[7] = '#';
    local_228[8] = '\x12';
    local_228[9] = 0x91;
    local_228[10] = 'g';
    local_228[0xb] = '\x11';
    local_228[0xc] = '\x0f';
    local_228[0xd] = '~';
    local_228[0xe] = 'b';
    local_228[0xf] = 0xd1;
    local_228[0x10] = 'P';
    local_228[0x11] = 'u';
    local_228[0x12] = 200;
    local_228[0x13] = 0x97;
    local_228[0x14] = 'e';
    local_228[0x15] = 199;
    local_228[0x16] = '<';
    local_228[0x17] = '\0';
    local_228[0x18] = 'd';
    local_228[0x19] = '\x11';
    local_228[0x1a] = 0xf6;
    local_228[0x1b] = 0x90;
    local_228[0x1c] = 'j';
    local_228[0x1d] = 0xb6;
    local_228[0x1e] = 0xe9;
    local_228[0x1f] = '3';
    local_1c8 = 0x40;
    test_sha256_eq((secp256k1_sha256 *)local_168,(secp256k1_sha256 *)local_228);
    local_228[0x10] = '\0';
    local_228[0x11] = '\0';
    local_228[0x12] = '\0';
    local_228[0x13] = '\0';
    local_228[0x14] = '\0';
    local_228[0x15] = '\0';
    local_228[0x16] = '\0';
    local_228[0x17] = '\0';
    local_228[0x18] = '\0';
    local_228[0x19] = '\0';
    local_228[0x1a] = '\0';
    local_228[0x1b] = '\0';
    local_228[0x1c] = '\0';
    local_228[0x1d] = '\0';
    local_228[0x1e] = '\0';
    local_228[0x1f] = '\x03';
    local_228[0] = '\0';
    local_228[1] = '\0';
    local_228[2] = '\0';
    local_228[3] = '\0';
    local_228[4] = '\0';
    local_228[5] = '\0';
    local_228[6] = '\0';
    local_228[7] = '\0';
    local_228[8] = '\0';
    local_228[9] = '\0';
    local_228[10] = '\0';
    local_228[0xb] = '\0';
    local_228[0xc] = '\0';
    local_228[0xd] = '\0';
    local_228[0xe] = '\0';
    local_228[0xf] = '\0';
    local_348 = (uchar *)0xb0996f8345c831b5;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0xf936e0bc13f10186;
    local_358 = (undefined1  [8])0x10c35892018a30f9;
    psStack_350 = (secp256k1_scalar *)0x29529df8854f3449;
    local_288.data[0x10] = '\0';
    local_288.data[0x11] = '\0';
    local_288.data[0x12] = '\0';
    local_288.data[0x13] = '\0';
    local_288.data[0x14] = '\0';
    local_288.data[0x15] = '\0';
    local_288.data[0x16] = '\0';
    local_288.data[0x17] = '\0';
    local_288.data[0x18] = '\0';
    local_288.data[0x19] = '\0';
    local_288.data[0x1a] = '\0';
    local_288.data[0x1b] = '\0';
    local_288.data[0x1c] = '\0';
    local_288.data[0x1d] = '\0';
    local_288.data[0x1e] = '\0';
    local_288.data[0x1f] = '\0';
    local_288.data[0] = '\0';
    local_288.data[1] = '\0';
    local_288.data[2] = '\0';
    local_288.data[3] = '\0';
    local_288.data[4] = '\0';
    local_288.data[5] = '\0';
    local_288.data[6] = '\0';
    local_288.data[7] = '\0';
    local_288.data[8] = '\0';
    local_288.data[9] = '\0';
    local_288.data[10] = '\0';
    local_288.data[0xb] = '\0';
    local_288.data[0xc] = '\0';
    local_288.data[0xd] = '\0';
    local_288.data[0xe] = '\0';
    local_288.data[0xf] = '\0';
    local_398.data[0x10] = '\0';
    local_398.data[0x11] = '\0';
    local_398.data[0x12] = '\0';
    local_398.data[0x13] = '\0';
    local_398.data[0x14] = '\0';
    local_398.data[0x15] = '\0';
    local_398.data[0x16] = '\0';
    local_398.data[0x17] = '\0';
    local_398.data[0x18] = '\0';
    local_398.data[0x19] = '\0';
    local_398.data[0x1a] = '\0';
    local_398.data[0x1b] = '\0';
    local_398.data[0x1c] = '\0';
    local_398.data[0x1d] = '\0';
    local_398.data[0x1e] = '\0';
    local_398.data[0x1f] = '\0';
    local_398.data[0] = '\0';
    local_398.data[1] = '\0';
    local_398.data[2] = '\0';
    local_398.data[3] = '\0';
    local_398.data[4] = '\0';
    local_398.data[5] = '\0';
    local_398.data[6] = '\0';
    local_398.data[7] = '\0';
    local_398.data[8] = '\0';
    local_398.data[9] = '\0';
    local_398.data[10] = '\0';
    local_398.data[0xb] = '\0';
    local_398.data[0xc] = '\0';
    local_398.data[0xd] = '\0';
    local_398.data[0xe] = '\0';
    local_398.data[0xf] = '\0';
    local_168[0x30] = 0xeb;
    local_168[0x31] = 0xee;
    local_168[0x32] = 0xe8;
    local_168[0x33] = 0xfd;
    local_168[0x34] = 0xb2;
    local_168[0x35] = '\x17';
    local_168[0x36] = '/';
    local_168[0x37] = 'G';
    local_168[0x38] = '}';
    local_168[0x39] = 0xf4;
    local_168[0x3a] = 0x90;
    local_168[0x3b] = '\r';
    local_168[0x3c] = '1';
    local_168[0x3d] = '\x05';
    local_168[0x3e] = '6';
    local_168[0x3f] = 0xc0;
    local_168[0x20] = '%';
    local_168[0x21] = 0xf6;
    local_168[0x22] = 'j';
    local_168[0x23] = 'J';
    local_168[0x24] = 0x85;
    local_168[0x25] = 0xea;
    local_168[0x26] = 0x8b;
    local_168[0x27] = 'q';
    local_168[0x28] = 0xe4;
    local_168[0x29] = 0x82;
    local_168[0x2a] = 0xa7;
    local_168[0x2b] = 'O';
    local_168[0x2c] = '8';
    local_168[0x2d] = '-';
    local_168[0x2e] = ',';
    local_168[0x2f] = 0xe5;
    local_168[0x10] = 'K';
    local_168[0x11] = 0xdf;
    local_168[0x12] = '\x1c';
    local_168[0x13] = '_';
    local_168[0x14] = 0x83;
    local_168[0x15] = '\a';
    local_168[0x16] = 0xb0;
    local_168[0x17] = '\b';
    local_168[0x18] = 'L';
    local_168[0x19] = 'U';
    local_168[0x1a] = 0xf1;
    local_168[0x1b] = 0xce;
    local_168[0x1c] = '-';
    local_168[0x1d] = 0xca;
    local_168[0x1e] = 0x82;
    local_168[0x1f] = '\x15';
    local_168[0] = 0xe9;
    local_168[1] = '\a';
    local_168[2] = 0x83;
    local_168[3] = '\x1f';
    local_168[4] = 0x80;
    local_168[5] = 0x84;
    local_168[6] = 0x8d;
    local_168[7] = '\x10';
    local_168[8] = 'i';
    local_168[9] = 0xa5;
    local_168[10] = '7';
    local_168[0xb] = '\x1b';
    local_168[0xc] = '@';
    local_168[0xd] = '$';
    local_168[0xe] = '\x10';
    local_168[0xf] = '6';
    test_schnorrsig_bip_vectors_check_signing
              (local_228,local_358,local_288.data,local_398.data,0x20,local_168);
    test_schnorrsig_bip_vectors_check_verify(local_358,local_398.data,0x20,local_168,1);
    local_228[0x10] = 'b';
    local_228[0x11] = 0xe7;
    local_228[0x12] = '\x16';
    local_228[0x13] = '\x0f';
    local_228[0x14] = '8';
    local_228[0x15] = 0xb4;
    local_228[0x16] = 0xda;
    local_228[0x17] = 'V';
    local_228[0x18] = 0xa7;
    local_228[0x19] = 0x84;
    local_228[0x1a] = 0xd9;
    local_228[0x1b] = '\x04';
    local_228[0x1c] = 'Q';
    local_228[0x1d] = 0x90;
    local_228[0x1e] = 0xcf;
    local_228[0x1f] = 0xef;
    local_228[0] = 0xb7;
    local_228[1] = 0xe1;
    local_228[2] = 'Q';
    local_228[3] = 'b';
    local_228[4] = 0x8a;
    local_228[5] = 0xed;
    local_228[6] = '*';
    local_228[7] = 'j';
    local_228[8] = 0xbf;
    local_228[9] = 'q';
    local_228[10] = 'X';
    local_228[0xb] = 0x80;
    local_228[0xc] = 0x9c;
    local_228[0xd] = 0xf4;
    local_228[0xe] = 0xf3;
    local_228[0xf] = 199;
    local_348 = (uchar *)0xd8cedea21daefe58;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0x59a62b507b0f2443;
    local_358 = (undefined1  [8])0x5f1c672a7fd7f1df;
    psStack_350 = (secp256k1_scalar *)0xbe4123db26371836;
    local_288.data[0x10] = '\0';
    local_288.data[0x11] = '\0';
    local_288.data[0x12] = '\0';
    local_288.data[0x13] = '\0';
    local_288.data[0x14] = '\0';
    local_288.data[0x15] = '\0';
    local_288.data[0x16] = '\0';
    local_288.data[0x17] = '\0';
    local_288.data[0x18] = '\0';
    local_288.data[0x19] = '\0';
    local_288.data[0x1a] = '\0';
    local_288.data[0x1b] = '\0';
    local_288.data[0x1c] = '\0';
    local_288.data[0x1d] = '\0';
    local_288.data[0x1e] = '\0';
    local_288.data[0x1f] = '\x01';
    local_288.data[0] = '\0';
    local_288.data[1] = '\0';
    local_288.data[2] = '\0';
    local_288.data[3] = '\0';
    local_288.data[4] = '\0';
    local_288.data[5] = '\0';
    local_288.data[6] = '\0';
    local_288.data[7] = '\0';
    local_288.data[8] = '\0';
    local_288.data[9] = '\0';
    local_288.data[10] = '\0';
    local_288.data[0xb] = '\0';
    local_288.data[0xc] = '\0';
    local_288.data[0xd] = '\0';
    local_288.data[0xe] = '\0';
    local_288.data[0xf] = '\0';
    local_398.data[0x10] = 0xa4;
    local_398.data[0x11] = '\t';
    local_398.data[0x12] = '8';
    local_398.data[0x13] = '\"';
    local_398.data[0x14] = ')';
    local_398.data[0x15] = 0x9f;
    local_398.data[0x16] = '1';
    local_398.data[0x17] = 0xd0;
    local_398.data[0x18] = '\b';
    local_398.data[0x19] = '.';
    local_398.data[0x1a] = 0xfa;
    local_398.data[0x1b] = 0x98;
    local_398.data[0x1c] = 0xec;
    local_398.data[0x1d] = 'N';
    local_398.data[0x1e] = 'l';
    local_398.data[0x1f] = 0x89;
    local_398.data[0] = '$';
    local_398.data[1] = '?';
    local_398.data[2] = 'j';
    local_398.data[3] = 0x88;
    local_398.data[4] = 0x85;
    local_398.data[5] = 0xa3;
    local_398.data[6] = '\b';
    local_398.data[7] = 0xd3;
    local_398.data[8] = '\x13';
    local_398.data[9] = '\x19';
    local_398.data[10] = 0x8a;
    local_398.data[0xb] = '.';
    local_398.data[0xc] = '\x03';
    local_398.data[0xd] = 'p';
    local_398.data[0xe] = 's';
    local_398.data[0xf] = 'D';
    local_168[0x30] = 0x89;
    local_168[0x31] = '~';
    local_168[0x32] = 0xfc;
    local_168[0x33] = 0xb6;
    local_168[0x34] = '9';
    local_168[0x35] = 0xea;
    local_168[0x36] = 0x87;
    local_168[0x37] = '\x1c';
    local_168[0x38] = 0xfa;
    local_168[0x39] = 0x95;
    local_168[0x3a] = 0xf6;
    local_168[0x3b] = 0xde;
    local_168[0x3c] = '3';
    local_168[0x3d] = 0x9e;
    local_168[0x3e] = 'K';
    local_168[0x3f] = '\n';
    local_168[0x20] = 0x89;
    local_168[0x21] = '\x06';
    local_168[0x22] = 0xd1;
    local_168[0x23] = '\x1a';
    local_168[0x24] = 0xc9;
    local_168[0x25] = 'v';
    local_168[0x26] = 0xab;
    local_168[0x27] = 0xcc;
    local_168[0x28] = 0xb2;
    local_168[0x29] = '\v';
    local_168[0x2a] = '\t';
    local_168[0x2b] = '\x12';
    local_168[0x2c] = 0x92;
    local_168[0x2d] = 0xbf;
    local_168[0x2e] = 0xf4;
    local_168[0x2f] = 0xea;
    local_168[0x10] = '\x1b';
    local_168[0x11] = 0xde;
    local_168[0x12] = 'A';
    local_168[0x13] = '>';
    local_168[0x14] = 'm';
    local_168[0x15] = 'C';
    local_168[0x16] = 0xf9;
    local_168[0x17] = '\x17';
    local_168[0x18] = 0xdc;
    local_168[0x19] = 0x8d;
    local_168[0x1a] = 0xcf;
    local_168[0x1b] = 0x8c;
    local_168[0x1c] = 'x';
    local_168[0x1d] = 0xde;
    local_168[0x1e] = '3';
    local_168[0x1f] = 'A';
    local_168[0] = 'h';
    local_168[1] = 0x96;
    local_168[2] = 0xbd;
    local_168[3] = '`';
    local_168[4] = 0xee;
    local_168[5] = 0xae;
    local_168[6] = ')';
    local_168[7] = 'm';
    local_168[8] = 0xb4;
    local_168[9] = 0x8a;
    local_168[10] = '\"';
    local_168[0xb] = 0x9f;
    local_168[0xc] = 0xf7;
    local_168[0xd] = '\x1d';
    local_168[0xe] = 0xfe;
    local_168[0xf] = '\a';
    test_schnorrsig_bip_vectors_check_signing
              (local_228,local_358,local_288.data,local_398.data,0x20,local_168);
    test_schnorrsig_bip_vectors_check_verify(local_358,local_398.data,0x20,local_168,1);
    local_228[0x10] = ')';
    local_228[0x11] = '\x02';
    local_228[0x12] = 'N';
    local_228[0x13] = '\b';
    local_228[0x14] = 0x8a;
    local_228[0x15] = 'g';
    local_228[0x16] = 0xcc;
    local_228[0x17] = 't';
    local_228[0x18] = '\x02';
    local_228[0x19] = '\v';
    local_228[0x1a] = 0xbe;
    local_228[0x1b] = 0xa6;
    local_228[0x1c] = ';';
    local_228[0x1d] = '\x14';
    local_228[0x1e] = 0xe5;
    local_228[0x1f] = 0xc9;
    local_228[0] = 0xc9;
    local_228[1] = '\x0f';
    local_228[2] = 0xda;
    local_228[3] = 0xa2;
    local_228[4] = '!';
    local_228[5] = 'h';
    local_228[6] = 0xc2;
    local_228[7] = '4';
    local_228[8] = 0xc4;
    local_228[9] = 0xc6;
    local_228[10] = 'b';
    local_228[0xb] = 0x8b;
    local_228[0xc] = 0x80;
    local_228[0xd] = 0xdc;
    local_228[0xe] = '\x1c';
    local_228[0xf] = 0xd1;
    local_348 = (uchar *)0xc986b00953713901;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0xb84e7769d98fe160;
    local_358 = (undefined1  [8])0x137e77c5fe8a30dd;
    psStack_350 = (secp256k1_scalar *)0xccb7c19c2ba71f12;
    local_288.data[0x10] = '\b';
    local_288.data[0x11] = '\x0e';
    local_288.data[0x12] = 'v';
    local_288.data[0x13] = 0xcd;
    local_288.data[0x14] = 0xc6;
    local_288.data[0x15] = 0xd1;
    local_288.data[0x16] = 'i';
    local_288.data[0x17] = ',';
    local_288.data[0x18] = 'K';
    local_288.data[0x19] = '\v';
    local_288.data[0x1a] = 'b';
    local_288.data[0x1b] = 0xd7;
    local_288.data[0x1c] = 0x98;
    local_288.data[0x1d] = 0xe6;
    local_288.data[0x1e] = 0xd9;
    local_288.data[0x1f] = '\x06';
    local_288.data[0] = 200;
    local_288.data[1] = 'z';
    local_288.data[2] = 0xa5;
    local_288.data[3] = '8';
    local_288.data[4] = '$';
    local_288.data[5] = 0xb4;
    local_288.data[6] = 0xd7;
    local_288.data[7] = 0xae;
    local_288.data[8] = '.';
    local_288.data[9] = 0xb0;
    local_288.data[10] = '5';
    local_288.data[0xb] = 0xa2;
    local_288.data[0xc] = 0xb5;
    local_288.data[0xd] = 0xbb;
    local_288.data[0xe] = 0xbc;
    local_288.data[0xf] = 0xcc;
    local_398.data[0x10] = 0xda;
    local_398.data[0x11] = 0x98;
    local_398.data[0x12] = '\x05';
    local_398.data[0x13] = 0xaa;
    local_398.data[0x14] = 0xb5;
    local_398.data[0x15] = 'l';
    local_398.data[0x16] = 'w';
    local_398.data[0x17] = '3';
    local_398.data[0x18] = '0';
    local_398.data[0x19] = '$';
    local_398.data[0x1a] = 0xb9;
    local_398.data[0x1b] = 0xd0;
    local_398.data[0x1c] = 0xa5;
    local_398.data[0x1d] = '\b';
    local_398.data[0x1e] = 0xb7;
    local_398.data[0x1f] = '\\';
    local_398.data[0] = '~';
    local_398.data[1] = '-';
    local_398.data[2] = 'X';
    local_398.data[3] = 0xd8;
    local_398.data[4] = 0xb3;
    local_398.data[5] = 0xbc;
    local_398.data[6] = 0xdf;
    local_398.data[7] = '\x1a';
    local_398.data[8] = 0xba;
    local_398.data[9] = 0xde;
    local_398.data[10] = 199;
    local_398.data[0xb] = 0x82;
    local_398.data[0xc] = 0x90;
    local_398.data[0xd] = 'T';
    local_398.data[0xe] = 0xf9;
    local_398.data[0xf] = '\r';
    local_168[0x30] = 'z';
    local_168[0x31] = 0xde;
    local_168[0x32] = 0xa9;
    local_168[0x33] = 0x8d;
    local_168[0x34] = 0x82;
    local_168[0x35] = 0xf8;
    local_168[0x36] = 'H';
    local_168[0x37] = '\x1e';
    local_168[0x38] = '\x0e';
    local_168[0x39] = '\x1e';
    local_168[0x3a] = '\x03';
    local_168[0x3b] = 'g';
    local_168[0x3c] = 'J';
    local_168[0x3d] = 'o';
    local_168[0x3e] = '?';
    local_168[0x3f] = 0xb7;
    local_168[0x20] = 0xab;
    local_168[0x21] = 't';
    local_168[0x22] = 'X';
    local_168[0x23] = 'y';
    local_168[0x24] = 0xa5;
    local_168[0x25] = 0xad;
    local_168[0x26] = 0x95;
    local_168[0x27] = 'J';
    local_168[0x28] = 'r';
    local_168[0x29] = 0xc4;
    local_168[0x2a] = 'Z';
    local_168[0x2b] = 0x91;
    local_168[0x2c] = 0xc3;
    local_168[0x2d] = 0xa5;
    local_168[0x2e] = '\x1d';
    local_168[0x2f] = '<';
    local_168[0x10] = 0xc4;
    local_168[0x11] = 0x9b;
    local_168[0x12] = 0xcf;
    local_168[0x13] = '*';
    local_168[0x14] = '`';
    local_168[0x15] = 'r';
    local_168[0x16] = 0x8d;
    local_168[0x17] = 0x8b;
    local_168[0x18] = 'L';
    local_168[0x19] = ' ';
    local_168[0x1a] = '\x0f';
    local_168[0x1b] = 'P';
    local_168[0x1c] = 0xdd;
    local_168[0x1d] = '1';
    local_168[0x1e] = '<';
    local_168[0x1f] = '\x1b';
    local_168[0] = 'X';
    local_168[1] = '1';
    local_168[2] = 0xaa;
    local_168[3] = 0xee;
    local_168[4] = 0xd7;
    local_168[5] = 0xb4;
    local_168[6] = 'K';
    local_168[7] = 0xb7;
    local_168[8] = 'N';
    local_168[9] = '^';
    local_168[10] = 0xab;
    local_168[0xb] = 0x94;
    local_168[0xc] = 0xba;
    local_168[0xd] = 0x9d;
    local_168[0xe] = 'B';
    local_168[0xf] = 0x94;
    test_schnorrsig_bip_vectors_check_signing
              (local_228,local_358,local_288.data,local_398.data,0x20,local_168);
    test_schnorrsig_bip_vectors_check_verify(local_358,local_398.data,0x20,local_168,1);
    local_228[0x10] = '\x12';
    local_228[0x11] = 'w';
    local_228[0x12] = '0';
    local_228[0x13] = 'b';
    local_228[0x14] = 0xcf;
    local_228[0x15] = '?';
    local_228[0x16] = 0xa2;
    local_228[0x17] = 'T';
    local_228[0x18] = 0x9e;
    local_228[0x19] = 'D';
    local_228[0x1a] = 0xf5;
    local_228[0x1b] = 0x8e;
    local_228[0x1c] = 0xd2;
    local_228[0x1d] = '@';
    local_228[0x1e] = '\x17';
    local_228[0x1f] = '\x10';
    local_228[0] = '\v';
    local_228[1] = 'C';
    local_228[2] = '+';
    local_228[3] = '&';
    local_228[4] = 'w';
    local_228[5] = 0x93;
    local_228[6] = 's';
    local_228[7] = 0x81;
    local_228[8] = 0xae;
    local_228[9] = 0xf0;
    local_228[10] = '[';
    local_228[0xb] = 0xb0;
    local_228[0xc] = '*';
    local_228[0xd] = 'f';
    local_228[0xe] = 0xec;
    local_228[0xf] = 0xd0;
    local_348 = (uchar *)0x8a461df2fb950d3a;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0x17f5d860c1f8331b;
    local_358 = (undefined1  [8])0x25f50551f9dfd125;
    psStack_350 = (secp256k1_scalar *)0xad96a928f622403c;
    local_288.data[0x10] = 0xff;
    local_288.data[0x11] = 0xff;
    local_288.data[0x12] = 0xff;
    local_288.data[0x13] = 0xff;
    local_288.data[0x14] = 0xff;
    local_288.data[0x15] = 0xff;
    local_288.data[0x16] = 0xff;
    local_288.data[0x17] = 0xff;
    local_288.data[0x18] = 0xff;
    local_288.data[0x19] = 0xff;
    local_288.data[0x1a] = 0xff;
    local_288.data[0x1b] = 0xff;
    local_288.data[0x1c] = 0xff;
    local_288.data[0x1d] = 0xff;
    local_288.data[0x1e] = 0xff;
    local_288.data[0x1f] = 0xff;
    local_288.data[0] = 0xff;
    local_288.data[1] = 0xff;
    local_288.data[2] = 0xff;
    local_288.data[3] = 0xff;
    local_288.data[4] = 0xff;
    local_288.data[5] = 0xff;
    local_288.data[6] = 0xff;
    local_288.data[7] = 0xff;
    local_288.data[8] = 0xff;
    local_288.data[9] = 0xff;
    local_288.data[10] = 0xff;
    local_288.data[0xb] = 0xff;
    local_288.data[0xc] = 0xff;
    local_288.data[0xd] = 0xff;
    local_288.data[0xe] = 0xff;
    local_288.data[0xf] = 0xff;
    local_398.data[0x10] = 0xff;
    local_398.data[0x11] = 0xff;
    local_398.data[0x12] = 0xff;
    local_398.data[0x13] = 0xff;
    local_398.data[0x14] = 0xff;
    local_398.data[0x15] = 0xff;
    local_398.data[0x16] = 0xff;
    local_398.data[0x17] = 0xff;
    local_398.data[0x18] = 0xff;
    local_398.data[0x19] = 0xff;
    local_398.data[0x1a] = 0xff;
    local_398.data[0x1b] = 0xff;
    local_398.data[0x1c] = 0xff;
    local_398.data[0x1d] = 0xff;
    local_398.data[0x1e] = 0xff;
    local_398.data[0x1f] = 0xff;
    local_398.data[0] = 0xff;
    local_398.data[1] = 0xff;
    local_398.data[2] = 0xff;
    local_398.data[3] = 0xff;
    local_398.data[4] = 0xff;
    local_398.data[5] = 0xff;
    local_398.data[6] = 0xff;
    local_398.data[7] = 0xff;
    local_398.data[8] = 0xff;
    local_398.data[9] = 0xff;
    local_398.data[10] = 0xff;
    local_398.data[0xb] = 0xff;
    local_398.data[0xc] = 0xff;
    local_398.data[0xd] = 0xff;
    local_398.data[0xe] = 0xff;
    local_398.data[0xf] = 0xff;
    local_168[0x30] = 0xf2;
    local_168[0x31] = '_';
    local_168[0x32] = 0xd7;
    local_168[0x33] = 0x88;
    local_168[0x34] = 0x81;
    local_168[0x35] = 0xeb;
    local_168[0x36] = 0xb3;
    local_168[0x37] = '\'';
    local_168[0x38] = 'q';
    local_168[0x39] = 0xfc;
    local_168[0x3a] = 'Y';
    local_168[0x3b] = '\"';
    local_168[0x3c] = 0xef;
    local_168[0x3d] = 0xc6;
    local_168[0x3e] = 'n';
    local_168[0x3f] = 0xa3;
    local_168[0x20] = 0x97;
    local_168[0x21] = 'X';
    local_168[0x22] = '+';
    local_168[0x23] = 0x9c;
    local_168[0x24] = 0xb1;
    local_168[0x25] = '=';
    local_168[0x26] = 0xb3;
    local_168[0x27] = 0x93;
    local_168[0x28] = '7';
    local_168[0x29] = '\x05';
    local_168[0x2a] = 0xb3;
    local_168[0x2b] = '+';
    local_168[0x2c] = 0xa9;
    local_168[0x2d] = 0x82;
    local_168[0x2e] = 0xaf;
    local_168[0x2f] = 'Z';
    local_168[0x10] = 'e';
    local_168[0x11] = 0xec;
    local_168[0x12] = 0xc1;
    local_168[0x13] = 0xa1;
    local_168[0x14] = 0x87;
    local_168[0x15] = 0xdd;
    local_168[0x16] = 'Q';
    local_168[0x17] = 0xb6;
    local_168[0x18] = 'O';
    local_168[0x19] = 0xda;
    local_168[0x1a] = '\x1e';
    local_168[0x1b] = 0xdc;
    local_168[0x1c] = 0x96;
    local_168[0x1d] = '7';
    local_168[0x1e] = 0xd5;
    local_168[0x1f] = 0xec;
    local_168[0] = '~';
    local_168[1] = 0xb0;
    local_168[2] = 'P';
    local_168[3] = 0x97;
    local_168[4] = 'W';
    local_168[5] = 0xe2;
    local_168[6] = 'F';
    local_168[7] = 0xf1;
    local_168[8] = 0x94;
    local_168[9] = 'I';
    local_168[10] = 0x88;
    local_168[0xb] = 'V';
    local_168[0xc] = 'Q';
    local_168[0xd] = 'a';
    local_168[0xe] = '\x1c';
    local_168[0xf] = 0xb9;
    test_schnorrsig_bip_vectors_check_signing
              (local_228,local_358,local_288.data,local_398.data,0x20,local_168);
    test_schnorrsig_bip_vectors_check_verify(local_358,local_398.data,0x20,local_168,1);
    local_228[0x10] = '}';
    local_228[0x11] = 0xfa;
    local_228[0x12] = '0';
    local_228[0x13] = 't';
    local_228[0x14] = 'm';
    local_228[0x15] = 0x8b;
    local_228[0x16] = 0xe2;
    local_228[0x17] = 0xaa;
    local_228[0x18] = 'e';
    local_228[0x19] = 0x97;
    local_228[0x1a] = '_';
    local_228[0x1b] = ')';
    local_228[0x1c] = 0xd2;
    local_228[0x1d] = '-';
    local_228[0x1e] = 199;
    local_228[0x1f] = 0xb9;
    local_228[0] = 0xd6;
    local_228[1] = 0x9c;
    local_228[2] = '5';
    local_228[3] = '\t';
    local_228[4] = 0xbb;
    local_228[5] = 0x99;
    local_228[6] = 0xe4;
    local_228[7] = '\x12';
    local_228[8] = 0xe6;
    local_228[9] = 0x8b;
    local_228[10] = '\x0f';
    local_228[0xb] = 0xe8;
    local_228[0xc] = 'T';
    local_228[0xd] = 'N';
    local_228[0xe] = 'r';
    local_228[0xf] = 0x83;
    local_348 = (uchar *)0x9b591ac87578f199;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0x36769b989986c56;
    local_358 = (undefined1  [8])0xb283cc8ff6c3f34d;
    psStack_350 = (secp256k1_scalar *)0x24a73104c9429d7e;
    local_168[0x30] = '`';
    local_168[0x31] = 0xcb;
    local_168[0x32] = 'q';
    local_168[0x33] = 0xc0;
    local_168[0x34] = 'N';
    local_168[0x35] = 0x80;
    local_168[0x36] = 0xf5;
    local_168[0x37] = 0x93;
    local_168[0x38] = '\x06';
    local_168[0x39] = '\v';
    local_168[0x3a] = '\a';
    local_168[0x3b] = 0xd2;
    local_168[0x3c] = 0x83;
    local_168[0x3d] = '\b';
    local_168[0x3e] = 0xd7;
    local_168[0x3f] = 0xf4;
    local_168[0x20] = 'v';
    local_168[0x21] = 0xaf;
    local_168[0x22] = 0xb1;
    local_168[0x23] = 'T';
    local_168[0x24] = 0x8a;
    local_168[0x25] = 0xf6;
    local_168[0x26] = '\x03';
    local_168[0x27] = 0xb3;
    local_168[0x28] = 0xeb;
    local_168[0x29] = 'E';
    local_168[0x2a] = 0xc9;
    local_168[0x2b] = 0xf8;
    local_168[0x2c] = ' ';
    local_168[0x2d] = '}';
    local_168[0x2e] = 0xee;
    local_168[0x2f] = '\x10';
    local_168[0x10] = 0x89;
    local_168[0x11] = 0xa0;
    local_168[0x12] = 0xed;
    local_168[0x13] = 0x94;
    local_168[0x14] = '\x14';
    local_168[0x15] = 0xf5;
    local_168[0x16] = 0xaa;
    local_168[0x17] = '(';
    local_168[0x18] = 0xad;
    local_168[0x19] = '\r';
    local_168[0x1a] = 0x96;
    local_168[0x1b] = 0xd6;
    local_168[0x1c] = 'y';
    local_168[0x1d] = '_';
    local_168[0x1e] = 0x9c;
    local_168[0x1f] = 'c';
    local_168[0] = '\0';
    local_168[1] = '\0';
    local_168[2] = '\0';
    local_168[3] = '\0';
    local_168[4] = '\0';
    local_168[5] = '\0';
    local_168[6] = '\0';
    local_168[7] = '\0';
    local_168[8] = '\0';
    local_168[9] = '\0';
    local_168[10] = '\0';
    local_168[0xb] = ';';
    local_168[0xc] = 'x';
    local_168[0xd] = 0xce;
    local_168[0xe] = 'V';
    local_168[0xf] = '?';
    test_schnorrsig_bip_vectors_check_verify(local_228,local_358,0x20,local_168,1);
    local_228[0x10] = 0xeb;
    local_228[0x11] = 0x98;
    local_228[0x12] = 0x98;
    local_228[0x13] = 0xae;
    local_228[0x14] = 'y';
    local_228[0x15] = 0xb9;
    local_228[0x16] = 'v';
    local_228[0x17] = 0x87;
    local_228[0x18] = 'f';
    local_228[0x19] = 0xe4;
    local_228[0x1a] = 0xfa;
    local_228[0x1b] = 0xa0;
    local_228[0x1c] = 'J';
    local_228[0x1d] = '-';
    local_228[0x1e] = 'J';
    local_228[0x1f] = '4';
    local_228[0] = 0xee;
    local_228[1] = 0xfd;
    local_228[2] = 0xea;
    local_228[3] = 'L';
    local_228[4] = 0xdb;
    local_228[5] = 'g';
    local_228[6] = 'w';
    local_228[7] = 'P';
    local_228[8] = 0xa4;
    local_228[9] = ' ';
    local_228[10] = 0xfe;
    local_228[0xb] = 0xe8;
    local_228[0xc] = '\a';
    local_228[0xd] = 0xea;
    local_228[0xe] = 0xcf;
    local_228[0xf] = '!';
    psVar9 = CTX;
    iVar7 = secp256k1_xonly_pubkey_parse(CTX,(secp256k1_xonly_pubkey *)local_168,local_228);
    if (iVar7 != 0) {
      run_schnorrsig_tests_cold_42();
LAB_001450cb:
      run_schnorrsig_tests_cold_43();
      goto LAB_001450d0;
    }
    local_228[0x10] = 'X';
    local_228[0x11] = 0xfe;
    local_228[0x12] = 0xae;
    local_228[0x13] = '\x1d';
    local_228[0x14] = 0xa2;
    local_228[0x15] = 0xde;
    local_228[0x16] = 0xce;
    local_228[0x17] = 0xd8;
    local_228[0x18] = 'C';
    local_228[0x19] = '$';
    local_228[0x1a] = '\x0f';
    local_228[0x1b] = '{';
    local_228[0x1c] = 'P';
    local_228[0x1d] = '+';
    local_228[0x1e] = 0xa6;
    local_228[0x1f] = 'Y';
    local_228[0] = 0xdf;
    local_228[1] = 0xf1;
    local_228[2] = 0xd7;
    local_228[3] = '\x7f';
    local_228[4] = '*';
    local_228[5] = 'g';
    local_228[6] = '\x1c';
    local_228[7] = '_';
    local_228[8] = '6';
    local_228[9] = '\x18';
    local_228[10] = '7';
    local_228[0xb] = '&';
    local_228[0xc] = 0xdb;
    local_228[0xd] = '#';
    local_228[0xe] = 'A';
    local_228[0xf] = 0xbe;
    local_348 = (uchar *)0xd0319f29223809a4;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    local_358 = (undefined1  [8])0xd308a385886a3f24;
    psStack_350 = (secp256k1_scalar *)0x447370032e8a1913;
    local_168[0x30] = 'z';
    local_168[0x31] = 's';
    local_168[0x32] = 0xc6;
    local_168[0x33] = 'C';
    local_168[0x34] = 0xe1;
    local_168[0x35] = 'f';
    local_168[0x36] = 0xbe;
    local_168[0x37] = '^';
    local_168[0x38] = 0xbe;
    local_168[0x39] = 0xaf;
    local_168[0x3a] = 0xa3;
    local_168[0x3b] = 'K';
    local_168[0x3c] = '\x1a';
    local_168[0x3d] = 0xc5;
    local_168[0x3e] = 'S';
    local_168[0x3f] = 0xe2;
    local_168[0x20] = '<';
    local_168[0x21] = 0xc2;
    local_168[0x22] = 'y';
    local_168[0x23] = 'D';
    local_168[0x24] = 'd';
    local_168[0x25] = '\n';
    local_168[0x26] = 0xc6;
    local_168[0x27] = '\a';
    local_168[0x28] = 0xcd;
    local_168[0x29] = '\x10';
    local_168[0x2a] = 'z';
    local_168[0x2b] = 0xe1;
    local_168[0x2c] = '\t';
    local_168[0x2d] = '#';
    local_168[0x2e] = 0xd9;
    local_168[0x2f] = 0xef;
    local_168[0x10] = 0x82;
    local_168[0x11] = 0xf6;
    local_168[0x12] = 'G';
    local_168[0x13] = '/';
    local_168[0x14] = 0x85;
    local_168[0x15] = 'h';
    local_168[0x16] = 0xa1;
    local_168[0x17] = 0x8b;
    local_168[0x18] = '/';
    local_168[0x19] = '\x05';
    local_168[0x1a] = 'z';
    local_168[0x1b] = '\x14';
    local_168[0x1c] = '`';
    local_168[0x1d] = ')';
    local_168[0x1e] = 'u';
    local_168[0x1f] = 'V';
    local_168[0] = 0xff;
    local_168[1] = 0xf9;
    local_168[2] = '{';
    local_168[3] = 0xd5;
    local_168[4] = 'u';
    local_168[5] = '^';
    local_168[6] = 0xee;
    local_168[7] = 0xa4;
    local_168[8] = ' ';
    local_168[9] = 'E';
    local_168[10] = ':';
    local_168[0xb] = '\x14';
    local_168[0xc] = '5';
    local_168[0xd] = 'R';
    local_168[0xe] = '5';
    local_168[0xf] = 0xd3;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_358,0x20,local_168,0);
    local_228[0x10] = 'X';
    local_228[0x11] = 0xfe;
    local_228[0x12] = 0xae;
    local_228[0x13] = '\x1d';
    local_228[0x14] = 0xa2;
    local_228[0x15] = 0xde;
    local_228[0x16] = 0xce;
    local_228[0x17] = 0xd8;
    local_228[0x18] = 'C';
    local_228[0x19] = '$';
    local_228[0x1a] = '\x0f';
    local_228[0x1b] = '{';
    local_228[0x1c] = 'P';
    local_228[0x1d] = '+';
    local_228[0x1e] = 0xa6;
    local_228[0x1f] = 'Y';
    local_228[0] = 0xdf;
    local_228[1] = 0xf1;
    local_228[2] = 0xd7;
    local_228[3] = '\x7f';
    local_228[4] = '*';
    local_228[5] = 'g';
    local_228[6] = '\x1c';
    local_228[7] = '_';
    local_228[8] = '6';
    local_228[9] = '\x18';
    local_228[10] = '7';
    local_228[0xb] = '&';
    local_228[0xc] = 0xdb;
    local_228[0xd] = '#';
    local_228[0xe] = 'A';
    local_228[0xf] = 0xbe;
    local_348 = (uchar *)0xd0319f29223809a4;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    local_358 = (undefined1  [8])0xd308a385886a3f24;
    psStack_350 = (secp256k1_scalar *)0x447370032e8a1913;
    local_168[0x30] = 'b';
    local_168[0x31] = '*';
    local_168[0x32] = 0x95;
    local_168[0x33] = 'L';
    local_168[0x34] = 0xfe;
    local_168[0x35] = 'T';
    local_168[0x36] = 'W';
    local_168[0x37] = '5';
    local_168[0x38] = 0xaa;
    local_168[0x39] = 0xea;
    local_168[0x3a] = 'Q';
    local_168[0x3b] = '4';
    local_168[0x3c] = 0xfc;
    local_168[0x3d] = 0xcd;
    local_168[0x3e] = 0xb2;
    local_168[0x3f] = 0xbd;
    local_168[0x20] = '(';
    local_168[0x21] = 0x89;
    local_168[0x22] = '\v';
    local_168[0x23] = '>';
    local_168[0x24] = 0xdb;
    local_168[0x25] = 'n';
    local_168[0x26] = 'q';
    local_168[0x27] = 0x89;
    local_168[0x28] = 0xb6;
    local_168[0x29] = '0';
    local_168[0x2a] = 'D';
    local_168[0x2b] = 0x8b;
    local_168[0x2c] = 'Q';
    local_168[0x2d] = '\\';
    local_168[0x2e] = 0xe4;
    local_168[0x2f] = 0xf8;
    local_168[0x10] = 0xb4;
    local_168[0x11] = '2';
    local_168[0x12] = 0xb0;
    local_168[0x13] = '\x13';
    local_168[0x14] = 0xdf;
    local_168[0x15] = '?';
    local_168[0x16] = 'o';
    local_168[0x17] = 0xf4;
    local_168[0x18] = 0xf9;
    local_168[0x19] = 0x9f;
    local_168[0x1a] = 0xcb;
    local_168[0x1b] = '3';
    local_168[0x1c] = 0xe0;
    local_168[0x1d] = 0xe1;
    local_168[0x1e] = 'Q';
    local_168[0x1f] = '_';
    local_168[0] = '\x1f';
    local_168[1] = 0xa6;
    local_168[2] = '.';
    local_168[3] = '3';
    local_168[4] = '\x1e';
    local_168[5] = 0xdb;
    local_168[6] = 0xc2;
    local_168[7] = '\x1c';
    local_168[8] = '9';
    local_168[9] = 'G';
    local_168[10] = 0x92;
    local_168[0xb] = 0xd2;
    local_168[0xc] = 0xab;
    local_168[0xd] = '\x11';
    local_168[0xe] = '\0';
    local_168[0xf] = 0xa7;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_358,0x20,local_168,0);
    local_228[0x10] = 'X';
    local_228[0x11] = 0xfe;
    local_228[0x12] = 0xae;
    local_228[0x13] = '\x1d';
    local_228[0x14] = 0xa2;
    local_228[0x15] = 0xde;
    local_228[0x16] = 0xce;
    local_228[0x17] = 0xd8;
    local_228[0x18] = 'C';
    local_228[0x19] = '$';
    local_228[0x1a] = '\x0f';
    local_228[0x1b] = '{';
    local_228[0x1c] = 'P';
    local_228[0x1d] = '+';
    local_228[0x1e] = 0xa6;
    local_228[0x1f] = 'Y';
    local_228[0] = 0xdf;
    local_228[1] = 0xf1;
    local_228[2] = 0xd7;
    local_228[3] = '\x7f';
    local_228[4] = '*';
    local_228[5] = 'g';
    local_228[6] = '\x1c';
    local_228[7] = '_';
    local_228[8] = '6';
    local_228[9] = '\x18';
    local_228[10] = '7';
    local_228[0xb] = '&';
    local_228[0xc] = 0xdb;
    local_228[0xd] = '#';
    local_228[0xe] = 'A';
    local_228[0xf] = 0xbe;
    local_348 = (uchar *)0xd0319f29223809a4;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    local_358 = (undefined1  [8])0xd308a385886a3f24;
    psStack_350 = (secp256k1_scalar *)0x447370032e8a1913;
    local_168[0x30] = 0xe8;
    local_168[0x31] = 0xd7;
    local_168[0x32] = 0xc9;
    local_168[0x33] = '>';
    local_168[0x34] = '\0';
    local_168[0x35] = 0xc5;
    local_168[0x36] = 0xed;
    local_168[0x37] = '\f';
    local_168[0x38] = '\x18';
    local_168[0x39] = '4';
    local_168[0x3a] = 0xff;
    local_168[0x3b] = '\r';
    local_168[0x3c] = '\f';
    local_168[0x3d] = '.';
    local_168[0x3e] = 'm';
    local_168[0x3f] = 0xa6;
    local_168[0x20] = 0x96;
    local_168[0x21] = '\x17';
    local_168[0x22] = 'd';
    local_168[0x23] = 0xb3;
    local_168[0x24] = 0xaa;
    local_168[0x25] = 0x9b;
    local_168[0x26] = '/';
    local_168[0x27] = 0xfc;
    local_168[0x28] = 0xb6;
    local_168[0x29] = 0xef;
    local_168[0x2a] = 0x94;
    local_168[0x2b] = '{';
    local_168[0x2c] = 'h';
    local_168[0x2d] = 0x87;
    local_168[0x2e] = 0xa2;
    local_168[0x2f] = '&';
    local_168[0x10] = 't';
    local_168[0x11] = 0xc1;
    local_168[0x12] = 0x97;
    local_168[0x13] = '`';
    local_168[0x14] = 0x89;
    local_168[0x15] = 0xb2;
    local_168[0x16] = 0xd9;
    local_168[0x17] = 0x96;
    local_168[0x18] = '=';
    local_168[0x19] = 0xa2;
    local_168[0x1a] = 0xe5;
    local_168[0x1b] = 'T';
    local_168[0x1c] = '>';
    local_168[0x1d] = '\x17';
    local_168[0x1e] = 'w';
    local_168[0x1f] = 'i';
    local_168[0] = 'l';
    local_168[1] = 0xff;
    local_168[2] = '\\';
    local_168[3] = ';';
    local_168[4] = 0xa8;
    local_168[5] = 'l';
    local_168[6] = 'i';
    local_168[7] = 0xea;
    local_168[8] = 'K';
    local_168[9] = 's';
    local_168[10] = 'v';
    local_168[0xb] = 0xf3;
    local_168[0xc] = '\x1a';
    local_168[0xd] = 0x9b;
    local_168[0xe] = 0xcb;
    local_168[0xf] = 'O';
    test_schnorrsig_bip_vectors_check_verify(local_228,local_358,0x20,local_168,0);
    local_228[0x10] = 'X';
    local_228[0x11] = 0xfe;
    local_228[0x12] = 0xae;
    local_228[0x13] = '\x1d';
    local_228[0x14] = 0xa2;
    local_228[0x15] = 0xde;
    local_228[0x16] = 0xce;
    local_228[0x17] = 0xd8;
    local_228[0x18] = 'C';
    local_228[0x19] = '$';
    local_228[0x1a] = '\x0f';
    local_228[0x1b] = '{';
    local_228[0x1c] = 'P';
    local_228[0x1d] = '+';
    local_228[0x1e] = 0xa6;
    local_228[0x1f] = 'Y';
    local_228[0] = 0xdf;
    local_228[1] = 0xf1;
    local_228[2] = 0xd7;
    local_228[3] = '\x7f';
    local_228[4] = '*';
    local_228[5] = 'g';
    local_228[6] = '\x1c';
    local_228[7] = '_';
    local_228[8] = '6';
    local_228[9] = '\x18';
    local_228[10] = '7';
    local_228[0xb] = '&';
    local_228[0xc] = 0xdb;
    local_228[0xd] = '#';
    local_228[0xe] = 'A';
    local_228[0xf] = 0xbe;
    local_348 = (uchar *)0xd0319f29223809a4;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    local_358 = (undefined1  [8])0xd308a385886a3f24;
    psStack_350 = (secp256k1_scalar *)0x447370032e8a1913;
    local_168[0x30] = 'O';
    local_168[0x31] = 0xb7;
    local_168[0x32] = '4';
    local_168[0x33] = 'v';
    local_168[0x34] = 0xf0;
    local_168[0x35] = 0xd5;
    local_168[0x36] = 0x94;
    local_168[0x37] = 0xdc;
    local_168[0x38] = 0xb6;
    local_168[0x39] = '\\';
    local_168[0x3a] = 'd';
    local_168[0x3b] = '%';
    local_168[0x3c] = 0xbd;
    local_168[0x3d] = '\x18';
    local_168[0x3e] = '`';
    local_168[0x3f] = 'Q';
    local_168[0x20] = '\x12';
    local_168[0x21] = '=';
    local_168[0x22] = 0xda;
    local_168[0x23] = 0x83;
    local_168[0x24] = '(';
    local_168[0x25] = 0xaf;
    local_168[0x26] = 0x9c;
    local_168[0x27] = '#';
    local_168[0x28] = 0xa9;
    local_168[0x29] = 'L';
    local_168[0x2a] = '\x1f';
    local_168[0x2b] = 0xee;
    local_168[0x2c] = 0xcf;
    local_168[0x2d] = 0xd1;
    local_168[0x2e] = '#';
    local_168[0x2f] = 0xba;
    local_168[0x10] = '\0';
    local_168[0x11] = '\0';
    local_168[0x12] = '\0';
    local_168[0x13] = '\0';
    local_168[0x14] = '\0';
    local_168[0x15] = '\0';
    local_168[0x16] = '\0';
    local_168[0x17] = '\0';
    local_168[0x18] = '\0';
    local_168[0x19] = '\0';
    local_168[0x1a] = '\0';
    local_168[0x1b] = '\0';
    local_168[0x1c] = '\0';
    local_168[0x1d] = '\0';
    local_168[0x1e] = '\0';
    local_168[0x1f] = '\0';
    local_168[0] = '\0';
    local_168[1] = '\0';
    local_168[2] = '\0';
    local_168[3] = '\0';
    local_168[4] = '\0';
    local_168[5] = '\0';
    local_168[6] = '\0';
    local_168[7] = '\0';
    local_168[8] = '\0';
    local_168[9] = '\0';
    local_168[10] = '\0';
    local_168[0xb] = '\0';
    local_168[0xc] = '\0';
    local_168[0xd] = '\0';
    local_168[0xe] = '\0';
    local_168[0xf] = '\0';
    test_schnorrsig_bip_vectors_check_verify(local_228,local_358,0x20,local_168,0);
    local_228[0x10] = 'X';
    local_228[0x11] = 0xfe;
    local_228[0x12] = 0xae;
    local_228[0x13] = '\x1d';
    local_228[0x14] = 0xa2;
    local_228[0x15] = 0xde;
    local_228[0x16] = 0xce;
    local_228[0x17] = 0xd8;
    local_228[0x18] = 'C';
    local_228[0x19] = '$';
    local_228[0x1a] = '\x0f';
    local_228[0x1b] = '{';
    local_228[0x1c] = 'P';
    local_228[0x1d] = '+';
    local_228[0x1e] = 0xa6;
    local_228[0x1f] = 'Y';
    local_228[0] = 0xdf;
    local_228[1] = 0xf1;
    local_228[2] = 0xd7;
    local_228[3] = '\x7f';
    local_228[4] = '*';
    local_228[5] = 'g';
    local_228[6] = '\x1c';
    local_228[7] = '_';
    local_228[8] = '6';
    local_228[9] = '\x18';
    local_228[10] = '7';
    local_228[0xb] = '&';
    local_228[0xc] = 0xdb;
    local_228[0xd] = '#';
    local_228[0xe] = 'A';
    local_228[0xf] = 0xbe;
    local_348 = (uchar *)0xd0319f29223809a4;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    local_358 = (undefined1  [8])0xd308a385886a3f24;
    psStack_350 = (secp256k1_scalar *)0x447370032e8a1913;
    local_168[0x30] = 0xdb;
    local_168[0x31] = 0xa8;
    local_168[0x32] = '\x7f';
    local_168[0x33] = '\x11';
    local_168[0x34] = 0xac;
    local_168[0x35] = 'g';
    local_168[0x36] = 'T';
    local_168[0x37] = 0xf9;
    local_168[0x38] = '7';
    local_168[0x39] = 0x80;
    local_168[0x3a] = 0xd5;
    local_168[0x3b] = 0xa1;
    local_168[0x3c] = 0x83;
    local_168[0x3d] = '|';
    local_168[0x3e] = 0xf1;
    local_168[0x3f] = 0x97;
    local_168[0x20] = 'v';
    local_168[0x21] = '\x15';
    local_168[0x22] = 0xfb;
    local_168[0x23] = 0xaf;
    local_168[0x24] = 'Z';
    local_168[0x25] = 0xe2;
    local_168[0x26] = 0x88;
    local_168[0x27] = 'd';
    local_168[0x28] = '\x01';
    local_168[0x29] = '<';
    local_168[0x2a] = '\t';
    local_168[0x2b] = 0x97;
    local_168[0x2c] = 'B';
    local_168[0x2d] = 0xde;
    local_168[0x2e] = 0xad;
    local_168[0x2f] = 0xb4;
    local_168[0x10] = '\0';
    local_168[0x11] = '\0';
    local_168[0x12] = '\0';
    local_168[0x13] = '\0';
    local_168[0x14] = '\0';
    local_168[0x15] = '\0';
    local_168[0x16] = '\0';
    local_168[0x17] = '\0';
    local_168[0x18] = '\0';
    local_168[0x19] = '\0';
    local_168[0x1a] = '\0';
    local_168[0x1b] = '\0';
    local_168[0x1c] = '\0';
    local_168[0x1d] = '\0';
    local_168[0x1e] = '\0';
    local_168[0x1f] = '\x01';
    local_168[0] = '\0';
    local_168[1] = '\0';
    local_168[2] = '\0';
    local_168[3] = '\0';
    local_168[4] = '\0';
    local_168[5] = '\0';
    local_168[6] = '\0';
    local_168[7] = '\0';
    local_168[8] = '\0';
    local_168[9] = '\0';
    local_168[10] = '\0';
    local_168[0xb] = '\0';
    local_168[0xc] = '\0';
    local_168[0xd] = '\0';
    local_168[0xe] = '\0';
    local_168[0xf] = '\0';
    test_schnorrsig_bip_vectors_check_verify(local_228,local_358,0x20,local_168,0);
    local_228[0x10] = 'X';
    local_228[0x11] = 0xfe;
    local_228[0x12] = 0xae;
    local_228[0x13] = '\x1d';
    local_228[0x14] = 0xa2;
    local_228[0x15] = 0xde;
    local_228[0x16] = 0xce;
    local_228[0x17] = 0xd8;
    local_228[0x18] = 'C';
    local_228[0x19] = '$';
    local_228[0x1a] = '\x0f';
    local_228[0x1b] = '{';
    local_228[0x1c] = 'P';
    local_228[0x1d] = '+';
    local_228[0x1e] = 0xa6;
    local_228[0x1f] = 'Y';
    local_228[0] = 0xdf;
    local_228[1] = 0xf1;
    local_228[2] = 0xd7;
    local_228[3] = '\x7f';
    local_228[4] = '*';
    local_228[5] = 'g';
    local_228[6] = '\x1c';
    local_228[7] = '_';
    local_228[8] = '6';
    local_228[9] = '\x18';
    local_228[10] = '7';
    local_228[0xb] = '&';
    local_228[0xc] = 0xdb;
    local_228[0xd] = '#';
    local_228[0xe] = 'A';
    local_228[0xf] = 0xbe;
    local_348 = (uchar *)0xd0319f29223809a4;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    local_358 = (undefined1  [8])0xd308a385886a3f24;
    psStack_350 = (secp256k1_scalar *)0x447370032e8a1913;
    local_168[0x30] = 0xd1;
    local_168[0x31] = 0xd7;
    local_168[0x32] = '\x13';
    local_168[0x33] = 0xa8;
    local_168[0x34] = 0xae;
    local_168[0x35] = 0x82;
    local_168[0x36] = 0xb3;
    local_168[0x37] = '/';
    local_168[0x38] = 0xa7;
    local_168[0x39] = 0x9d;
    local_168[0x3a] = '_';
    local_168[0x3b] = '\x7f';
    local_168[0x3c] = 0xc4;
    local_168[0x3d] = '\a';
    local_168[0x3e] = 0xd3;
    local_168[0x3f] = 0x9b;
    local_168[0x20] = 'i';
    local_168[0x21] = 0xe8;
    local_168[0x22] = 0x9b;
    local_168[0x23] = 'L';
    local_168[0x24] = 'U';
    local_168[0x25] = 'd';
    local_168[0x26] = 0xd0;
    local_168[0x27] = '\x03';
    local_168[0x28] = 'I';
    local_168[0x29] = '\x10';
    local_168[0x2a] = 'k';
    local_168[0x2b] = 0x84;
    local_168[0x2c] = 0x97;
    local_168[0x2d] = 'x';
    local_168[0x2e] = ']';
    local_168[0x2f] = 0xd7;
    local_168[0x10] = 'V';
    local_168[0x11] = 'M';
    local_168[0x12] = 0xa8;
    local_168[0x13] = '+';
    local_168[0x14] = '\x0f';
    local_168[0x15] = '&';
    local_168[0x16] = 0x9b;
    local_168[0x17] = 199;
    local_168[0x18] = '\n';
    local_168[0x19] = 't';
    local_168[0x1a] = 0xf8;
    local_168[0x1b] = '\"';
    local_168[0x1c] = '\x04';
    local_168[0x1d] = ')';
    local_168[0x1e] = 0xba;
    local_168[0x1f] = '\x1d';
    local_168[0] = 'J';
    local_168[1] = ')';
    local_168[2] = 0x8d;
    local_168[3] = 0xac;
    local_168[4] = 0xae;
    local_168[5] = 'W';
    local_168[6] = '9';
    local_168[7] = 'Z';
    local_168[8] = '\x15';
    local_168[9] = 0xd0;
    local_168[10] = 'y';
    local_168[0xb] = ']';
    local_168[0xc] = 0xdb;
    local_168[0xd] = 0xfd;
    local_168[0xe] = '\x1d';
    local_168[0xf] = 0xcb;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_358,0x20,local_168,0);
    local_228[0x10] = 'X';
    local_228[0x11] = 0xfe;
    local_228[0x12] = 0xae;
    local_228[0x13] = '\x1d';
    local_228[0x14] = 0xa2;
    local_228[0x15] = 0xde;
    local_228[0x16] = 0xce;
    local_228[0x17] = 0xd8;
    local_228[0x18] = 'C';
    local_228[0x19] = '$';
    local_228[0x1a] = '\x0f';
    local_228[0x1b] = '{';
    local_228[0x1c] = 'P';
    local_228[0x1d] = '+';
    local_228[0x1e] = 0xa6;
    local_228[0x1f] = 'Y';
    local_228[0] = 0xdf;
    local_228[1] = 0xf1;
    local_228[2] = 0xd7;
    local_228[3] = '\x7f';
    local_228[4] = '*';
    local_228[5] = 'g';
    local_228[6] = '\x1c';
    local_228[7] = '_';
    local_228[8] = '6';
    local_228[9] = '\x18';
    local_228[10] = '7';
    local_228[0xb] = '&';
    local_228[0xc] = 0xdb;
    local_228[0xd] = '#';
    local_228[0xe] = 'A';
    local_228[0xf] = 0xbe;
    local_348 = (uchar *)0xd0319f29223809a4;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    local_358 = (undefined1  [8])0xd308a385886a3f24;
    psStack_350 = (secp256k1_scalar *)0x447370032e8a1913;
    local_168[0x30] = 0xd1;
    local_168[0x31] = 0xd7;
    local_168[0x32] = '\x13';
    local_168[0x33] = 0xa8;
    local_168[0x34] = 0xae;
    local_168[0x35] = 0x82;
    local_168[0x36] = 0xb3;
    local_168[0x37] = '/';
    local_168[0x38] = 0xa7;
    local_168[0x39] = 0x9d;
    local_168[0x3a] = '_';
    local_168[0x3b] = '\x7f';
    local_168[0x3c] = 0xc4;
    local_168[0x3d] = '\a';
    local_168[0x3e] = 0xd3;
    local_168[0x3f] = 0x9b;
    local_168[0x20] = 'i';
    local_168[0x21] = 0xe8;
    local_168[0x22] = 0x9b;
    local_168[0x23] = 'L';
    local_168[0x24] = 'U';
    local_168[0x25] = 'd';
    local_168[0x26] = 0xd0;
    local_168[0x27] = '\x03';
    local_168[0x28] = 'I';
    local_168[0x29] = '\x10';
    local_168[0x2a] = 'k';
    local_168[0x2b] = 0x84;
    local_168[0x2c] = 0x97;
    local_168[0x2d] = 'x';
    local_168[0x2e] = ']';
    local_168[0x2f] = 0xd7;
    local_168[0x10] = 0xff;
    local_168[0x11] = 0xff;
    local_168[0x12] = 0xff;
    local_168[0x13] = 0xff;
    local_168[0x14] = 0xff;
    local_168[0x15] = 0xff;
    local_168[0x16] = 0xff;
    local_168[0x17] = 0xff;
    local_168[0x18] = 0xff;
    local_168[0x19] = 0xff;
    local_168[0x1a] = 0xff;
    local_168[0x1b] = 0xfe;
    local_168[0x1c] = 0xff;
    local_168[0x1d] = 0xff;
    local_168[0x1e] = 0xfc;
    local_168[0x1f] = '/';
    local_168[0] = 0xff;
    local_168[1] = 0xff;
    local_168[2] = 0xff;
    local_168[3] = 0xff;
    local_168[4] = 0xff;
    local_168[5] = 0xff;
    local_168[6] = 0xff;
    local_168[7] = 0xff;
    local_168[8] = 0xff;
    local_168[9] = 0xff;
    local_168[10] = 0xff;
    local_168[0xb] = 0xff;
    local_168[0xc] = 0xff;
    local_168[0xd] = 0xff;
    local_168[0xe] = 0xff;
    local_168[0xf] = 0xff;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_358,0x20,local_168,0);
    local_228[0x10] = 'X';
    local_228[0x11] = 0xfe;
    local_228[0x12] = 0xae;
    local_228[0x13] = '\x1d';
    local_228[0x14] = 0xa2;
    local_228[0x15] = 0xde;
    local_228[0x16] = 0xce;
    local_228[0x17] = 0xd8;
    local_228[0x18] = 'C';
    local_228[0x19] = '$';
    local_228[0x1a] = '\x0f';
    local_228[0x1b] = '{';
    local_228[0x1c] = 'P';
    local_228[0x1d] = '+';
    local_228[0x1e] = 0xa6;
    local_228[0x1f] = 'Y';
    local_228[0] = 0xdf;
    local_228[1] = 0xf1;
    local_228[2] = 0xd7;
    local_228[3] = '\x7f';
    local_228[4] = '*';
    local_228[5] = 'g';
    local_228[6] = '\x1c';
    local_228[7] = '_';
    local_228[8] = '6';
    local_228[9] = '\x18';
    local_228[10] = '7';
    local_228[0xb] = '&';
    local_228[0xc] = 0xdb;
    local_228[0xd] = '#';
    local_228[0xe] = 'A';
    local_228[0xf] = 0xbe;
    local_348 = (uchar *)0xd0319f29223809a4;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    local_358 = (undefined1  [8])0xd308a385886a3f24;
    psStack_350 = (secp256k1_scalar *)0x447370032e8a1913;
    local_168[0x30] = 0xba;
    local_168[0x31] = 0xae;
    local_168[0x32] = 0xdc;
    local_168[0x33] = 0xe6;
    local_168[0x34] = 0xaf;
    local_168[0x35] = 'H';
    local_168[0x36] = 0xa0;
    local_168[0x37] = ';';
    local_168[0x38] = 0xbf;
    local_168[0x39] = 0xd2;
    local_168[0x3a] = '^';
    local_168[0x3b] = 0x8c;
    local_168[0x3c] = 0xd0;
    local_168[0x3d] = '6';
    local_168[0x3e] = 'A';
    local_168[0x3f] = 'A';
    local_168[0x20] = 0xff;
    local_168[0x21] = 0xff;
    local_168[0x22] = 0xff;
    local_168[0x23] = 0xff;
    local_168[0x24] = 0xff;
    local_168[0x25] = 0xff;
    local_168[0x26] = 0xff;
    local_168[0x27] = 0xff;
    local_168[0x28] = 0xff;
    local_168[0x29] = 0xff;
    local_168[0x2a] = 0xff;
    local_168[0x2b] = 0xff;
    local_168[0x2c] = 0xff;
    local_168[0x2d] = 0xff;
    local_168[0x2e] = 0xff;
    local_168[0x2f] = 0xfe;
    local_168[0x10] = 't';
    local_168[0x11] = 0xc1;
    local_168[0x12] = 0x97;
    local_168[0x13] = '`';
    local_168[0x14] = 0x89;
    local_168[0x15] = 0xb2;
    local_168[0x16] = 0xd9;
    local_168[0x17] = 0x96;
    local_168[0x18] = '=';
    local_168[0x19] = 0xa2;
    local_168[0x1a] = 0xe5;
    local_168[0x1b] = 'T';
    local_168[0x1c] = '>';
    local_168[0x1d] = '\x17';
    local_168[0x1e] = 'w';
    local_168[0x1f] = 'i';
    local_168[0] = 'l';
    local_168[1] = 0xff;
    local_168[2] = '\\';
    local_168[3] = ';';
    local_168[4] = 0xa8;
    local_168[5] = 'l';
    local_168[6] = 'i';
    local_168[7] = 0xea;
    local_168[8] = 'K';
    local_168[9] = 's';
    local_168[10] = 'v';
    local_168[0xb] = 0xf3;
    local_168[0xc] = '\x1a';
    local_168[0xd] = 0x9b;
    local_168[0xe] = 0xcb;
    local_168[0xf] = 'O';
    test_schnorrsig_bip_vectors_check_verify(local_228,local_358,0x20,local_168,0);
    local_228[0x10] = 0xff;
    local_228[0x11] = 0xff;
    local_228[0x12] = 0xff;
    local_228[0x13] = 0xff;
    local_228[0x14] = 0xff;
    local_228[0x15] = 0xff;
    local_228[0x16] = 0xff;
    local_228[0x17] = 0xff;
    local_228[0x18] = 0xff;
    local_228[0x19] = 0xff;
    local_228[0x1a] = 0xff;
    local_228[0x1b] = 0xfe;
    local_228[0x1c] = 0xff;
    local_228[0x1d] = 0xff;
    local_228[0x1e] = 0xfc;
    local_228[0x1f] = '0';
    local_228[0] = 0xff;
    local_228[1] = 0xff;
    local_228[2] = 0xff;
    local_228[3] = 0xff;
    local_228[4] = 0xff;
    local_228[5] = 0xff;
    local_228[6] = 0xff;
    local_228[7] = 0xff;
    local_228[8] = 0xff;
    local_228[9] = 0xff;
    local_228[10] = 0xff;
    local_228[0xb] = 0xff;
    local_228[0xc] = 0xff;
    local_228[0xd] = 0xff;
    local_228[0xe] = 0xff;
    local_228[0xf] = 0xff;
    psVar9 = CTX;
    iVar7 = secp256k1_xonly_pubkey_parse(CTX,(secp256k1_xonly_pubkey *)local_168,local_228);
    if (iVar7 != 0) goto LAB_001450cb;
    local_228[0x10] = '\x03';
    local_228[0x11] = '@';
    local_228[0x12] = '\x03';
    local_228[0x13] = '@';
    local_228[0x14] = '\x03';
    local_228[0x15] = '@';
    local_228[0x16] = '\x03';
    local_228[0x17] = '@';
    local_228[0x18] = '\x03';
    local_228[0x19] = '@';
    local_228[0x1a] = '\x03';
    local_228[0x1b] = '@';
    local_228[0x1c] = '\x03';
    local_228[0x1d] = '@';
    local_228[0x1e] = '\x03';
    local_228[0x1f] = '@';
    local_228[0] = '\x03';
    local_228[1] = '@';
    local_228[2] = '\x03';
    local_228[3] = '@';
    local_228[4] = '\x03';
    local_228[5] = '@';
    local_228[6] = '\x03';
    local_228[7] = '@';
    local_228[8] = '\x03';
    local_228[9] = '@';
    local_228[10] = '\x03';
    local_228[0xb] = '@';
    local_228[0xc] = '\x03';
    local_228[0xd] = '@';
    local_228[0xe] = '\x03';
    local_228[0xf] = '@';
    local_348 = (uchar *)0x238be6f6b6faf94b;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0x17d16f4d32976408;
    local_358 = (undefined1  [8])0xc43a39b453aa8c77;
    psStack_350 = (secp256k1_scalar *)0x22877a49094d7767;
    local_288.data[0x10] = '\0';
    local_288.data[0x11] = '\0';
    local_288.data[0x12] = '\0';
    local_288.data[0x13] = '\0';
    local_288.data[0x14] = '\0';
    local_288.data[0x15] = '\0';
    local_288.data[0x16] = '\0';
    local_288.data[0x17] = '\0';
    local_288.data[0x18] = '\0';
    local_288.data[0x19] = '\0';
    local_288.data[0x1a] = '\0';
    local_288.data[0x1b] = '\0';
    local_288.data[0x1c] = '\0';
    local_288.data[0x1d] = '\0';
    local_288.data[0x1e] = '\0';
    local_288.data[0x1f] = '\0';
    local_288.data[0] = '\0';
    local_288.data[1] = '\0';
    local_288.data[2] = '\0';
    local_288.data[3] = '\0';
    local_288.data[4] = '\0';
    local_288.data[5] = '\0';
    local_288.data[6] = '\0';
    local_288.data[7] = '\0';
    local_288.data[8] = '\0';
    local_288.data[9] = '\0';
    local_288.data[10] = '\0';
    local_288.data[0xb] = '\0';
    local_288.data[0xc] = '\0';
    local_288.data[0xd] = '\0';
    local_288.data[0xe] = '\0';
    local_288.data[0xf] = '\0';
    local_168[0x30] = 0x9f;
    local_168[0x31] = '-';
    local_168[0x32] = 'V';
    local_168[0x33] = '\x0f';
    local_168[0x34] = 0xac;
    local_168[0x35] = 'e';
    local_168[0x36] = '(';
    local_168[0x37] = '\'';
    local_168[0x38] = 0xd1;
    local_168[0x39] = 0xaf;
    local_168[0x3a] = '\x05';
    local_168[0x3b] = 't';
    local_168[0x3c] = 0xe4;
    local_168[0x3d] = '\'';
    local_168[0x3e] = 0xab;
    local_168[0x3f] = 'c';
    local_168[0x20] = '`';
    local_168[0x21] = 'i';
    local_168[0x22] = 0xce;
    local_168[0x23] = '&';
    local_168[0x24] = 0xbf;
    local_168[0x25] = '\x03';
    local_168[0x26] = 'F';
    local_168[0x27] = 'b';
    local_168[0x28] = '(';
    local_168[0x29] = 0xf1;
    local_168[0x2a] = 0x9a;
    local_168[0x2b] = ':';
    local_168[0x2c] = 'b';
    local_168[0x2d] = 0xdb;
    local_168[0x2e] = 0x8a;
    local_168[0x2f] = 'd';
    local_168[0x10] = 'k';
    local_168[0x11] = 0xb6;
    local_168[0x12] = 0xad;
    local_168[0x13] = 'C';
    local_168[0x14] = 'g';
    local_168[0x15] = '2';
    local_168[0x16] = 0xfc;
    local_168[0x17] = 0xcc;
    local_168[0x18] = '%';
    local_168[0x19] = ')';
    local_168[0x1a] = '\x1a';
    local_168[0x1b] = 'U';
    local_168[0x1c] = 0x89;
    local_168[0x1d] = 'T';
    local_168[0x1e] = 'd';
    local_168[0x1f] = 0xcf;
    local_168[0] = 'q';
    local_168[1] = 'S';
    local_168[2] = ']';
    local_168[3] = 0xb1;
    local_168[4] = 'e';
    local_168[5] = 0xec;
    local_168[6] = 0xd9;
    local_168[7] = 0xfb;
    local_168[8] = 0xbc;
    local_168[9] = '\x04';
    local_168[10] = 'n';
    local_168[0xb] = '_';
    local_168[0xc] = 0xfa;
    local_168[0xd] = 0xea;
    local_168[0xe] = 'a';
    local_168[0xf] = '\x18';
    local_290 = 0;
    test_schnorrsig_bip_vectors_check_signing
              (local_228,local_358,local_288.data,(uchar *)0x0,0,local_168);
    test_schnorrsig_bip_vectors_check_verify(local_358,(uchar *)0x0,0,local_168,1);
    local_228[0x10] = '\x03';
    local_228[0x11] = '@';
    local_228[0x12] = '\x03';
    local_228[0x13] = '@';
    local_228[0x14] = '\x03';
    local_228[0x15] = '@';
    local_228[0x16] = '\x03';
    local_228[0x17] = '@';
    local_228[0x18] = '\x03';
    local_228[0x19] = '@';
    local_228[0x1a] = '\x03';
    local_228[0x1b] = '@';
    local_228[0x1c] = '\x03';
    local_228[0x1d] = '@';
    local_228[0x1e] = '\x03';
    local_228[0x1f] = '@';
    local_228[0] = '\x03';
    local_228[1] = '@';
    local_228[2] = '\x03';
    local_228[3] = '@';
    local_228[4] = '\x03';
    local_228[5] = '@';
    local_228[6] = '\x03';
    local_228[7] = '@';
    local_228[8] = '\x03';
    local_228[9] = '@';
    local_228[10] = '\x03';
    local_228[0xb] = '@';
    local_228[0xc] = '\x03';
    local_228[0xd] = '@';
    local_228[0xe] = '\x03';
    local_228[0xf] = '@';
    local_348 = (uchar *)0x238be6f6b6faf94b;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0x17d16f4d32976408;
    local_358 = (undefined1  [8])0xc43a39b453aa8c77;
    psStack_350 = (secp256k1_scalar *)0x22877a49094d7767;
    local_288.data[0x10] = '\0';
    local_288.data[0x11] = '\0';
    local_288.data[0x12] = '\0';
    local_288.data[0x13] = '\0';
    local_288.data[0x14] = '\0';
    local_288.data[0x15] = '\0';
    local_288.data[0x16] = '\0';
    local_288.data[0x17] = '\0';
    local_288.data[0x18] = '\0';
    local_288.data[0x19] = '\0';
    local_288.data[0x1a] = '\0';
    local_288.data[0x1b] = '\0';
    local_288.data[0x1c] = '\0';
    local_288.data[0x1d] = '\0';
    local_288.data[0x1e] = '\0';
    local_288.data[0x1f] = '\0';
    local_288.data[0] = '\0';
    local_288.data[1] = '\0';
    local_288.data[2] = '\0';
    local_288.data[3] = '\0';
    local_288.data[4] = '\0';
    local_288.data[5] = '\0';
    local_288.data[6] = '\0';
    local_288.data[7] = '\0';
    local_288.data[8] = '\0';
    local_288.data[9] = '\0';
    local_288.data[10] = '\0';
    local_288.data[0xb] = '\0';
    local_288.data[0xc] = '\0';
    local_288.data[0xd] = '\0';
    local_288.data[0xe] = '\0';
    local_288.data[0xf] = '\0';
    local_398.data[0] = '\x11';
    local_168[0x30] = 0xfe;
    local_168[0x31] = '|';
    local_168[0x32] = 0xac;
    local_168[0x33] = 0xfc;
    local_168[0x34] = 'Z';
    local_168[0x35] = 'W';
    local_168[0x36] = '}';
    local_168[0x37] = '3';
    local_168[0x38] = 0xec;
    local_168[0x39] = '\x14';
    local_168[0x3a] = 'V';
    local_168[0x3b] = 'L';
    local_168[0x3c] = 0xec;
    local_168[0x3d] = '+';
    local_168[0x3e] = 0xac;
    local_168[0x3f] = 0xbf;
    local_168[0x20] = 0xea;
    local_168[0x21] = '1';
    local_168[0x22] = 's';
    local_168[0x23] = 0xbf;
    local_168[0x24] = 0xea;
    local_168[0x25] = 'f';
    local_168[0x26] = 0x83;
    local_168[0x27] = 0xbd;
    local_168[0x28] = '\x10';
    local_168[0x29] = '\x1f';
    local_168[0x2a] = 0xa5;
    local_168[0x2b] = 0xaa;
    local_168[0x2c] = ']';
    local_168[0x2d] = 0xbc;
    local_168[0x2e] = '\x19';
    local_168[0x2f] = 0x96;
    local_168[0x10] = 0xb1;
    local_168[0x11] = 0xb9;
    local_168[0x12] = 0x93;
    local_168[0x13] = 'J';
    local_168[0x14] = 0xe6;
    local_168[0x15] = ';';
    local_168[0x16] = 'L';
    local_168[0x17] = '5';
    local_168[0x18] = '\x11';
    local_168[0x19] = 0xf3;
    local_168[0x1a] = 0xae;
    local_168[0x1b] = '\x11';
    local_168[0x1c] = '4';
    local_168[0x1d] = 0xc6;
    local_168[0x1e] = 0xa3;
    local_168[0x1f] = '\x03';
    local_168[0] = '\b';
    local_168[1] = 0xa2;
    local_168[2] = '\n';
    local_168[3] = '\n';
    local_168[4] = 0xfe;
    local_168[5] = 0xf6;
    local_168[6] = 'A';
    local_168[7] = '$';
    local_168[8] = 'd';
    local_168[9] = 0x92;
    local_168[10] = '2';
    local_168[0xb] = 0xe0;
    local_168[0xc] = 'i';
    local_168[0xd] = '<';
    local_168[0xe] = 'X';
    local_168[0xf] = ':';
    test_schnorrsig_bip_vectors_check_signing
              (local_228,local_358,local_288.data,local_398.data,1,local_168);
    test_schnorrsig_bip_vectors_check_verify(local_358,local_398.data,1,local_168,1);
    local_228[0x10] = '\x03';
    local_228[0x11] = '@';
    local_228[0x12] = '\x03';
    local_228[0x13] = '@';
    local_228[0x14] = '\x03';
    local_228[0x15] = '@';
    local_228[0x16] = '\x03';
    local_228[0x17] = '@';
    local_228[0x18] = '\x03';
    local_228[0x19] = '@';
    local_228[0x1a] = '\x03';
    local_228[0x1b] = '@';
    local_228[0x1c] = '\x03';
    local_228[0x1d] = '@';
    local_228[0x1e] = '\x03';
    local_228[0x1f] = '@';
    local_228[0] = '\x03';
    local_228[1] = '@';
    local_228[2] = '\x03';
    local_228[3] = '@';
    local_228[4] = '\x03';
    local_228[5] = '@';
    local_228[6] = '\x03';
    local_228[7] = '@';
    local_228[8] = '\x03';
    local_228[9] = '@';
    local_228[10] = '\x03';
    local_228[0xb] = '@';
    local_228[0xc] = '\x03';
    local_228[0xd] = '@';
    local_228[0xe] = '\x03';
    local_228[0xf] = '@';
    local_348 = (uchar *)0x238be6f6b6faf94b;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0x17d16f4d32976408;
    local_358 = (undefined1  [8])0xc43a39b453aa8c77;
    psStack_350 = (secp256k1_scalar *)0x22877a49094d7767;
    local_288.data[0x10] = '\0';
    local_288.data[0x11] = '\0';
    local_288.data[0x12] = '\0';
    local_288.data[0x13] = '\0';
    local_288.data[0x14] = '\0';
    local_288.data[0x15] = '\0';
    local_288.data[0x16] = '\0';
    local_288.data[0x17] = '\0';
    local_288.data[0x18] = '\0';
    local_288.data[0x19] = '\0';
    local_288.data[0x1a] = '\0';
    local_288.data[0x1b] = '\0';
    local_288.data[0x1c] = '\0';
    local_288.data[0x1d] = '\0';
    local_288.data[0x1e] = '\0';
    local_288.data[0x1f] = '\0';
    local_288.data[0] = '\0';
    local_288.data[1] = '\0';
    local_288.data[2] = '\0';
    local_288.data[3] = '\0';
    local_288.data[4] = '\0';
    local_288.data[5] = '\0';
    local_288.data[6] = '\0';
    local_288.data[7] = '\0';
    local_288.data[8] = '\0';
    local_288.data[9] = '\0';
    local_288.data[10] = '\0';
    local_288.data[0xb] = '\0';
    local_288.data[0xc] = '\0';
    local_288.data[0xd] = '\0';
    local_288.data[0xe] = '\0';
    local_288.data[0xf] = '\0';
    builtin_memcpy(local_398.data,"\x01\x02\x03\x04\x05\x06\a\b\t\n\v\f\r\x0e\x0f\x10\x11",0x11);
    local_168[0x30] = 0xe1;
    local_168[0x31] = 0xe5;
    local_168[0x32] = 0xa3;
    local_168[0x33] = '\x7f';
    local_168[0x34] = 0xd8;
    local_168[0x35] = '\x0e';
    local_168[0x36] = 'Z';
    local_168[0x37] = 'Q';
    local_168[0x38] = 0x89;
    local_168[0x39] = '|';
    local_168[0x3a] = 'U';
    local_168[0x3b] = 'f';
    local_168[0x3c] = 0xa9;
    local_168[0x3d] = '~';
    local_168[0x3e] = 0xa5;
    local_168[0x3f] = 0xa5;
    local_168[0x20] = 0xc4;
    local_168[0x21] = 0xa4;
    local_168[0x22] = 0x82;
    local_168[0x23] = 0xb7;
    local_168[0x24] = '{';
    local_168[0x25] = 0xf9;
    local_168[0x26] = '`';
    local_168[0x27] = 0xf8;
    local_168[0x28] = 'h';
    local_168[0x29] = '\x15';
    local_168[0x2a] = '@';
    local_168[0x2b] = 0xe2;
    local_168[0x2c] = '[';
    local_168[0x2d] = 'g';
    local_168[0x2e] = 'q';
    local_168[0x2f] = 0xec;
    local_168[0x10] = ']';
    local_168[0x11] = 0x86;
    local_168[0x12] = 0x99;
    local_168[0x13] = 0xd1;
    local_168[0x14] = 0xa7;
    local_168[0x15] = '\x1e';
    local_168[0x16] = '<';
    local_168[0x17] = 'R';
    local_168[0x18] = 0xda;
    local_168[0x19] = 0x9a;
    local_168[0x1a] = 0xfd;
    local_168[0x1b] = 0xb6;
    local_168[0x1c] = 0xb5;
    local_168[0x1d] = '\n';
    local_168[0x1e] = 0xc3;
    local_168[0x1f] = 'p';
    local_168[0] = 'Q';
    local_168[1] = '0';
    local_168[2] = 0xf3;
    local_168[3] = 0x9a;
    local_168[4] = '@';
    local_168[5] = 'Y';
    local_168[6] = 0xb4;
    local_168[7] = ';';
    local_168[8] = 199;
    local_168[9] = 0xca;
    local_168[10] = 0xc0;
    local_168[0xb] = 0x9a;
    local_168[0xc] = '\x19';
    local_168[0xd] = 0xec;
    local_168[0xe] = 0xe5;
    local_168[0xf] = '+';
    test_schnorrsig_bip_vectors_check_signing
              (local_228,local_358,local_288.data,local_398.data,0x11,local_168);
    test_schnorrsig_bip_vectors_check_verify(local_358,local_398.data,0x11,local_168,1);
    local_348 = (uchar *)0x4003400340034003;
    psStack_340 = (secp256k1_schnorrsig_extraparams *)0x4003400340034003;
    local_358 = (undefined1  [8])0x4003400340034003;
    psStack_350 = (secp256k1_scalar *)0x4003400340034003;
    local_288.data[0x10] = 'K';
    local_288.data[0x11] = 0xf9;
    local_288.data[0x12] = 0xfa;
    local_288.data[0x13] = 0xb6;
    local_288.data[0x14] = 0xf6;
    local_288.data[0x15] = 0xe6;
    local_288.data[0x16] = 0x8b;
    local_288.data[0x17] = '#';
    local_288.data[0x18] = '\b';
    local_288.data[0x19] = 'd';
    local_288.data[0x1a] = 0x97;
    local_288.data[0x1b] = '2';
    local_288.data[0x1c] = 'M';
    local_288.data[0x1d] = 'o';
    local_288.data[0x1e] = 0xd1;
    local_288.data[0x1f] = '\x17';
    local_288.data[0] = 'w';
    local_288.data[1] = 0x8c;
    local_288.data[2] = 0xaa;
    local_288.data[3] = 'S';
    local_288.data[4] = 0xb4;
    local_288.data[5] = '9';
    local_288.data[6] = ':';
    local_288.data[7] = 0xc4;
    local_288.data[8] = 'g';
    local_288.data[9] = 'w';
    local_288.data[10] = 'M';
    local_288.data[0xb] = '\t';
    local_288.data[0xc] = 'I';
    local_288.data[0xd] = 'z';
    local_288.data[0xe] = 0x87;
    local_288.data[0xf] = '\"';
    local_398.data[0x10] = '\0';
    local_398.data[0x11] = '\0';
    local_398.data[0x12] = '\0';
    local_398.data[0x13] = '\0';
    local_398.data[0x14] = '\0';
    local_398.data[0x15] = '\0';
    local_398.data[0x16] = '\0';
    local_398.data[0x17] = '\0';
    local_398.data[0x18] = '\0';
    local_398.data[0x19] = '\0';
    local_398.data[0x1a] = '\0';
    local_398.data[0x1b] = '\0';
    local_398.data[0x1c] = '\0';
    local_398.data[0x1d] = '\0';
    local_398.data[0x1e] = '\0';
    local_398.data[0x1f] = '\0';
    local_398.data[0] = '\0';
    local_398.data[1] = '\0';
    local_398.data[2] = '\0';
    local_398.data[3] = '\0';
    local_398.data[4] = '\0';
    local_398.data[5] = '\0';
    local_398.data[6] = '\0';
    local_398.data[7] = '\0';
    local_398.data[8] = '\0';
    local_398.data[9] = '\0';
    local_398.data[10] = '\0';
    local_398.data[0xb] = '\0';
    local_398.data[0xc] = '\0';
    local_398.data[0xd] = '\0';
    local_398.data[0xe] = '\0';
    local_398.data[0xf] = '\0';
    local_228[0x30] = 0x89;
    local_228[0x31] = '\x7f';
    local_228[0x32] = 0xcb;
    local_228[0x33] = 0xa0;
    local_228[0x34] = 0xe9;
    local_228[0x35] = 0xd0;
    local_228[0x36] = 0xb4;
    local_228[0x37] = 0xa0;
    local_228[0x38] = 'h';
    local_228[0x39] = 0x94;
    local_228[0x3a] = 0xcf;
    local_228[0x3b] = 0xd2;
    local_228[0x3c] = 'I';
    local_228[0x3d] = 0xf2;
    local_228[0x3e] = '#';
    local_228[0x3f] = 'g';
    local_228[0x20] = 'X';
    local_228[0x21] = '^';
    local_228[0x22] = 0xd3;
    local_228[0x23] = 0xe3;
    local_228[0x24] = '\x17';
    local_228[0x25] = '\b';
    local_228[0x26] = '\a';
    local_228[0x27] = 0xe7;
    local_228[0x28] = 0xc0;
    local_228[0x29] = ';';
    local_228[0x2a] = 'r';
    local_228[0x2b] = '\x0f';
    local_228[0x2c] = 0xc5;
    local_228[0x2d] = 'L';
    local_228[0x2e] = '{';
    local_228[0x2f] = '#';
    local_228[0x10] = '\x03';
    local_228[0x11] = '2';
    local_228[0x12] = '\x1e';
    local_228[0x13] = ']';
    local_228[0x14] = 0xbf;
    local_228[0x15] = 0xa8;
    local_228[0x16] = 0xbe;
    local_228[0x17] = 'o';
    local_228[0x18] = '\t';
    local_228[0x19] = '\x16';
    local_228[0x1a] = '5';
    local_228[0x1b] = '\x16';
    local_228[0x1c] = '>';
    local_228[0x1d] = 0xca;
    local_228[0x1e] = 'y';
    local_228[0x1f] = 0xa8;
    local_228[0] = '@';
    local_228[1] = ';';
    local_228[2] = '\x12';
    local_228[3] = 0xb0;
    local_228[4] = 0xd8;
    local_228[5] = 'U';
    local_228[6] = 'Z';
    local_228[7] = '4';
    local_228[8] = 'A';
    local_228[9] = 'u';
    local_228[10] = 0xea;
    local_228[0xb] = '~';
    local_228[0xc] = 199;
    local_228[0xd] = 'F';
    local_228[0xe] = 'V';
    local_228[0xf] = 'c';
    local_168[0x50] = 0x99;
    local_168[0x51] = 0x99;
    local_168[0x52] = 0x99;
    local_168[0x53] = 0x99;
    local_168[0x54] = 0x99;
    local_168[0x55] = 0x99;
    local_168[0x56] = 0x99;
    local_168[0x57] = 0x99;
    local_168[0x58] = 0x99;
    local_168[0x59] = 0x99;
    local_168[0x5a] = 0x99;
    local_168[0x5b] = 0x99;
    local_168[0x5c] = 0x99;
    local_168[0x5d] = 0x99;
    local_168[0x5e] = 0x99;
    local_168[0x5f] = 0x99;
    local_168[0x40] = 0x99;
    local_168[0x41] = 0x99;
    local_168[0x42] = 0x99;
    local_168[0x43] = 0x99;
    local_168[0x44] = 0x99;
    local_168[0x45] = 0x99;
    local_168[0x46] = 0x99;
    local_168[0x47] = 0x99;
    local_168[0x48] = 0x99;
    local_168[0x49] = 0x99;
    local_168[0x4a] = 0x99;
    local_168[0x4b] = 0x99;
    local_168[0x4c] = 0x99;
    local_168[0x4d] = 0x99;
    local_168[0x4e] = 0x99;
    local_168[0x4f] = 0x99;
    local_168[0x30] = 0x99;
    local_168[0x31] = 0x99;
    local_168[0x32] = 0x99;
    local_168[0x33] = 0x99;
    local_168[0x34] = 0x99;
    local_168[0x35] = 0x99;
    local_168[0x36] = 0x99;
    local_168[0x37] = 0x99;
    local_168[0x38] = 0x99;
    local_168[0x39] = 0x99;
    local_168[0x3a] = 0x99;
    local_168[0x3b] = 0x99;
    local_168[0x3c] = 0x99;
    local_168[0x3d] = 0x99;
    local_168[0x3e] = 0x99;
    local_168[0x3f] = 0x99;
    local_168[0x20] = 0x99;
    local_168[0x21] = 0x99;
    local_168[0x22] = 0x99;
    local_168[0x23] = 0x99;
    local_168[0x24] = 0x99;
    local_168[0x25] = 0x99;
    local_168[0x26] = 0x99;
    local_168[0x27] = 0x99;
    local_168[0x28] = 0x99;
    local_168[0x29] = 0x99;
    local_168[0x2a] = 0x99;
    local_168[0x2b] = 0x99;
    local_168[0x2c] = 0x99;
    local_168[0x2d] = 0x99;
    local_168[0x2e] = 0x99;
    local_168[0x2f] = 0x99;
    local_168[0x10] = 0x99;
    local_168[0x11] = 0x99;
    local_168[0x12] = 0x99;
    local_168[0x13] = 0x99;
    local_168[0x14] = 0x99;
    local_168[0x15] = 0x99;
    local_168[0x16] = 0x99;
    local_168[0x17] = 0x99;
    local_168[0x18] = 0x99;
    local_168[0x19] = 0x99;
    local_168[0x1a] = 0x99;
    local_168[0x1b] = 0x99;
    local_168[0x1c] = 0x99;
    local_168[0x1d] = 0x99;
    local_168[0x1e] = 0x99;
    local_168[0x1f] = 0x99;
    local_168[0] = 0x99;
    local_168[1] = 0x99;
    local_168[2] = 0x99;
    local_168[3] = 0x99;
    local_168[4] = 0x99;
    local_168[5] = 0x99;
    local_168[6] = 0x99;
    local_168[7] = 0x99;
    local_168[8] = 0x99;
    local_168[9] = 0x99;
    local_168[10] = 0x99;
    local_168[0xb] = 0x99;
    local_168[0xc] = 0x99;
    local_168[0xd] = 0x99;
    local_168[0xe] = 0x99;
    local_168[0xf] = 0x99;
    local_168._96_4_ = 0x99999999;
    test_schnorrsig_bip_vectors_check_signing
              (local_358,local_288.data,local_398.data,local_168,100,local_228);
    test_schnorrsig_bip_vectors_check_verify(local_288.data,local_168,100,local_228,1);
    if (COUNT < 1) break;
    while( true ) {
      pubkey = (secp256k1_xonly_pubkey *)local_228;
      local_2f8.d[2] = 0x6e68637320612072;
      local_2f8.d[3] = 0x2e2e67697372726f;
      local_2f8.d[0] = 0x2073692073696874;
      local_2f8.d[1] = 0x6f662067736d2061;
      local_398.data[0x30] = '\0';
      local_398.data[0x31] = '\0';
      local_398.data[0x32] = '\0';
      local_398.data[0x33] = '\0';
      local_398.data[0x34] = '\0';
      local_398.data[0x35] = '\0';
      local_398.data[0x36] = '\0';
      local_398.data[0x37] = '\0';
      local_398.data[0x38] = '\0';
      local_398.data[0x39] = '\0';
      local_398.data[0x3a] = '\0';
      local_398.data[0x3b] = '\0';
      local_398.data[0x3c] = '\0';
      local_398.data[0x3d] = '\0';
      local_398.data[0x3e] = '\0';
      local_398.data[0x3f] = '\0';
      local_398.data[0x20] = '\0';
      local_398.data[0x21] = '\0';
      local_398.data[0x22] = '\0';
      local_398.data[0x23] = '\0';
      local_398.data[0x24] = '\0';
      local_398.data[0x25] = '\0';
      local_398.data[0x26] = '\0';
      local_398.data[0x27] = '\0';
      local_398.data[0x28] = '\0';
      local_398.data[0x29] = '\0';
      local_398.data[0x2a] = '\0';
      local_398.data[0x2b] = '\0';
      local_398.data[0x2c] = '\0';
      local_398.data[0x2d] = '\0';
      local_398.data[0x2e] = '\0';
      local_398.data[0x2f] = '\0';
      local_398.data[0x10] = '\0';
      local_398.data[0x11] = '\0';
      local_398.data[0x12] = '\0';
      local_398.data[0x13] = '\0';
      local_398.data[0x14] = '\0';
      local_398.data[0x15] = '\0';
      local_398.data[0x16] = '\0';
      local_398.data[0x17] = '\0';
      local_398.data[0x18] = '\0';
      local_398.data[0x19] = '\0';
      local_398.data[0x1a] = '\0';
      local_398.data[0x1b] = '\0';
      local_398.data[0x1c] = '\0';
      local_398.data[0x1d] = '\0';
      local_398.data[0x1e] = '\0';
      local_398.data[0x1f] = '\0';
      local_398.data[0] = '\0';
      local_398.data[1] = '\0';
      local_398.data[2] = '\0';
      local_398.data[3] = '\0';
      local_398.data[4] = '\0';
      local_398.data[5] = '\0';
      local_398.data[6] = '\0';
      local_398.data[7] = '\0';
      local_398.data[8] = '\0';
      local_398.data[9] = '\0';
      local_398.data[10] = '\0';
      local_398.data[0xb] = '\0';
      local_398.data[0xc] = '\0';
      local_398.data[0xd] = '\0';
      local_398.data[0xe] = '\0';
      local_398.data[0xf] = '\0';
      local_3d8.ndata = (uchar *)0x0;
      local_3d8.magic[0] = 0xda;
      local_3d8.magic[1] = 'o';
      local_3d8.magic[2] = 0xb3;
      local_3d8.magic[3] = 0x8c;
      local_3d8._4_4_ = 0;
      local_3d8.noncefp = (secp256k1_nonce_function_hardened)0x0;
      secp256k1_testrand256(local_2b8);
      secp256k1_testrand256(local_2d8);
      iVar7 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)local_168,local_2b8);
      if (iVar7 == 0) break;
      iVar7 = secp256k1_keypair_xonly_pub(CTX,pubkey,(int *)0x0,(secp256k1_keypair *)local_168);
      if (iVar7 == 0) goto LAB_00144eaa;
      iVar7 = secp256k1_schnorrsig_sign_internal
                        (CTX,local_358,(uchar *)&local_2f8,0x20,(secp256k1_keypair *)local_168,
                         nonce_function_bip340,(void *)0x0);
      if (iVar7 == 0) goto LAB_00144eaf;
      iVar7 = secp256k1_schnorrsig_verify(CTX,local_358,(uchar *)&local_2f8,0x20,pubkey);
      if (iVar7 == 0) goto LAB_00144eb4;
      iVar7 = secp256k1_schnorrsig_sign_internal
                        (CTX,local_288.data,(uchar *)&local_2f8,0x20,(secp256k1_keypair *)local_168,
                         nonce_function_bip340,(void *)0x0);
      if (iVar7 == 0) goto LAB_00144eb9;
      lVar5 = 0;
      do {
        iVar7 = (uint)(byte)local_358[lVar5] - (uint)local_288.data[lVar5];
        if (local_358[lVar5] != local_288.data[lVar5]) goto LAB_0014449c;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x40);
      iVar7 = 0;
LAB_0014449c:
      if (iVar7 != 0) goto LAB_00144ebe;
      iVar7 = secp256k1_schnorrsig_sign_custom
                        (CTX,local_358,(uchar *)&local_2f8,0x20,(secp256k1_keypair *)local_168,
                         &local_3d8);
      if (iVar7 == 0) goto LAB_00144ec3;
      iVar7 = secp256k1_schnorrsig_verify(CTX,local_358,(uchar *)&local_2f8,0x20,pubkey);
      if (iVar7 == 0) goto LAB_00144ec8;
      builtin_memcpy(auStack_330 + 8,
                     "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10);
      local_338 = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      builtin_memcpy(auStack_330,"\x01\x01\x01\x01\x01\x01\x01\x01",8);
      local_348 = (uchar *)0x101010101010101;
      psStack_340 = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      local_358 = (undefined1  [8])0x101010101010101;
      psStack_350 = (secp256k1_scalar *)0x101010101010101;
      local_3d8.noncefp = nonce_function_failing;
      iVar7 = secp256k1_schnorrsig_sign_custom
                        (CTX,local_358,(uchar *)&local_2f8,0x20,(secp256k1_keypair *)local_168,
                         &local_3d8);
      if (iVar7 != 0) goto LAB_00144ecd;
      lVar5 = 0;
      do {
        iVar7 = (uint)(byte)local_358[lVar5] - (uint)local_398.data[lVar5];
        if (local_358[lVar5] != local_398.data[lVar5]) goto LAB_0014458b;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x40);
      iVar7 = 0;
LAB_0014458b:
      if (iVar7 != 0) goto LAB_00144ed2;
      builtin_memcpy(auStack_330 + 8,
                     "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10);
      local_338 = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      builtin_memcpy(auStack_330,"\x01\x01\x01\x01\x01\x01\x01\x01",8);
      local_348 = (uchar *)0x101010101010101;
      psStack_340 = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      local_358 = (undefined1  [8])0x101010101010101;
      psStack_350 = (secp256k1_scalar *)0x101010101010101;
      local_3d8.noncefp = nonce_function_0;
      iVar7 = secp256k1_schnorrsig_sign_custom
                        (CTX,local_358,(uchar *)&local_2f8,0x20,(secp256k1_keypair *)local_168,
                         &local_3d8);
      if (iVar7 != 0) goto LAB_00144ed7;
      lVar5 = 0;
      do {
        iVar7 = (uint)(byte)local_358[lVar5] - (uint)local_398.data[lVar5];
        if (local_358[lVar5] != local_398.data[lVar5]) goto LAB_0014461d;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x40);
      iVar7 = 0;
LAB_0014461d:
      if (iVar7 != 0) goto LAB_00144edc;
      builtin_memcpy(auStack_330 + 8,
                     "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10);
      local_338 = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      builtin_memcpy(auStack_330,"\x01\x01\x01\x01\x01\x01\x01\x01",8);
      local_348 = (uchar *)0x101010101010101;
      psStack_340 = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      local_358 = (undefined1  [8])0x101010101010101;
      psStack_350 = (secp256k1_scalar *)0x101010101010101;
      local_3d8.noncefp = nonce_function_overflowing;
      iVar7 = secp256k1_schnorrsig_sign_custom
                        (CTX,local_358,(uchar *)&local_2f8,0x20,(secp256k1_keypair *)local_168,
                         &local_3d8);
      if (iVar7 == 0) goto LAB_00144ee1;
      iVar7 = secp256k1_schnorrsig_verify(CTX,local_358,(uchar *)&local_2f8,0x20,pubkey);
      if (iVar7 == 0) goto LAB_00144ee6;
      local_3d8.noncefp = (secp256k1_nonce_function_hardened)0x0;
      local_3d8.ndata = local_2d8;
      iVar7 = secp256k1_schnorrsig_sign_custom
                        (CTX,local_358,(uchar *)&local_2f8,0x20,(secp256k1_keypair *)local_168,
                         &local_3d8);
      if (iVar7 == 0) goto LAB_00144eeb;
      iVar7 = secp256k1_schnorrsig_sign_internal
                        (CTX,local_288.data,(uchar *)&local_2f8,0x20,(secp256k1_keypair *)local_168,
                         nonce_function_bip340,local_3d8.ndata);
      if (iVar7 == 0) goto LAB_00144ef0;
      lVar5 = 0;
      do {
        iVar7 = (uint)(byte)local_358[lVar5] - (uint)local_288.data[lVar5];
        if (local_358[lVar5] != local_288.data[lVar5]) goto LAB_00144753;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x40);
      iVar7 = 0;
LAB_00144753:
      if (iVar7 != 0) goto LAB_00144ef5;
      secp256k1_testrand256(local_2b8);
      iVar7 = secp256k1_keypair_create(CTX,&local_288,local_2b8);
      if (iVar7 == 0) goto LAB_00144efa;
      iVar7 = secp256k1_keypair_xonly_pub(CTX,&local_398,(int *)0x0,&local_288);
      if (iVar7 == 0) goto LAB_00144eff;
      lVar5 = 0;
      do {
        puVar11 = local_358 + lVar5;
        secp256k1_testrand256(puVar11);
        iVar7 = secp256k1_schnorrsig_sign_internal
                          (CTX,pubkey->data,puVar11,0x20,&local_288,nonce_function_bip340,
                           (void *)0x0);
        if (iVar7 == 0) {
          run_schnorrsig_tests_cold_78();
LAB_00144e8c:
          run_schnorrsig_tests_cold_77();
LAB_00144e91:
          run_schnorrsig_tests_cold_109();
LAB_00144e96:
          run_schnorrsig_tests_cold_108();
LAB_00144e9b:
          run_schnorrsig_tests_cold_107();
LAB_00144ea0:
          run_schnorrsig_tests_cold_106();
          goto LAB_00144ea5;
        }
        iVar7 = secp256k1_schnorrsig_verify(CTX,pubkey->data,puVar11,0x20,&local_398);
        if (iVar7 == 0) goto LAB_00144e8c;
        lVar5 = lVar5 + 0x20;
        pubkey = pubkey + 1;
      } while (lVar5 != 0x60);
      uVar1 = secp256k1_testrand_int(3);
      uVar12 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
               secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0];
      uVar8 = secp256k1_test_state[1] << 0x11;
      uVar10 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar6 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar10;
      secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar6;
      secp256k1_test_state[2] = uVar10 ^ uVar8;
      secp256k1_test_state[3] = uVar6 << 0x2d | uVar6 >> 0x13;
      uVar12 = uVar12 >> 0x3b;
      uVar3 = secp256k1_testrand_int(0xfe);
      sig64 = local_228 + (ulong)uVar1 * 0x40;
      bVar13 = (char)uVar3 + 1;
      sig64[uVar12] = sig64[uVar12] ^ bVar13;
      puVar11 = local_358 + (ulong)uVar1 * 0x20;
      iVar7 = secp256k1_schnorrsig_verify(CTX,sig64,puVar11,0x20,&local_398);
      if (iVar7 != 0) goto LAB_00144f04;
      sig64[uVar12] = sig64[uVar12] ^ bVar13;
      uVar12 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
               secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0];
      uVar8 = secp256k1_test_state[1] << 0x11;
      uVar10 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar6 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar10;
      secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar6;
      secp256k1_test_state[2] = uVar10 ^ uVar8;
      secp256k1_test_state[3] = uVar6 << 0x2d | uVar6 >> 0x13;
      uVar12 = uVar12 >> 0x3b;
      sig64[uVar12 + 0x20] = sig64[uVar12 + 0x20] ^ bVar13;
      iVar7 = secp256k1_schnorrsig_verify(CTX,sig64,puVar11,0x20,&local_398);
      if (iVar7 != 0) goto LAB_00144f09;
      sig64[uVar12 + 0x20] = sig64[uVar12 + 0x20] ^ bVar13;
      uVar12 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
               secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0];
      uVar8 = secp256k1_test_state[1] << 0x11;
      uVar10 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar6 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar10;
      secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar6;
      secp256k1_test_state[2] = uVar10 ^ uVar8;
      secp256k1_test_state[3] = uVar6 << 0x2d | uVar6 >> 0x13;
      uVar12 = uVar12 >> 0x3b;
      puVar11[uVar12] = puVar11[uVar12] ^ bVar13;
      iVar7 = secp256k1_schnorrsig_verify(CTX,sig64,puVar11,0x20,&local_398);
      if (iVar7 != 0) goto LAB_00144f0e;
      puVar11[uVar12] = puVar11[uVar12] ^ bVar13;
      iVar7 = secp256k1_schnorrsig_verify(CTX,sig64,puVar11,0x20,&local_398);
      if (iVar7 == 0) goto LAB_00144f13;
      iVar7 = secp256k1_schnorrsig_sign_internal
                        (CTX,local_228,local_358,0x20,&local_288,nonce_function_bip340,(void *)0x0);
      if (iVar7 == 0) goto LAB_00144f18;
      iVar7 = secp256k1_schnorrsig_verify(CTX,local_228,local_358,0x20,&local_398);
      if (iVar7 == 0) goto LAB_00144f1d;
      local_228[0x30] = 0xff;
      local_228[0x31] = 0xff;
      local_228[0x32] = 0xff;
      local_228[0x33] = 0xff;
      local_228[0x34] = 0xff;
      local_228[0x35] = 0xff;
      local_228[0x36] = 0xff;
      local_228[0x37] = 0xff;
      local_228[0x38] = 0xff;
      local_228[0x39] = 0xff;
      local_228[0x3a] = 0xff;
      local_228[0x3b] = 0xff;
      local_228[0x3c] = 0xff;
      local_228[0x3d] = 0xff;
      local_228[0x3e] = 0xff;
      local_228[0x3f] = 0xff;
      local_228[0x20] = 0xff;
      local_228[0x21] = 0xff;
      local_228[0x22] = 0xff;
      local_228[0x23] = 0xff;
      local_228[0x24] = 0xff;
      local_228[0x25] = 0xff;
      local_228[0x26] = 0xff;
      local_228[0x27] = 0xff;
      local_228[0x28] = 0xff;
      local_228[0x29] = 0xff;
      local_228[0x2a] = 0xff;
      local_228[0x2b] = 0xff;
      local_228[0x2c] = 0xff;
      local_228[0x2d] = 0xff;
      local_228[0x2e] = 0xff;
      local_228[0x2f] = 0xff;
      iVar7 = secp256k1_schnorrsig_verify(CTX,local_228,local_358,0x20,&local_398);
      if (iVar7 != 0) goto LAB_00144f22;
      iVar7 = secp256k1_schnorrsig_sign_internal
                        (CTX,local_228,local_358,0x20,&local_288,nonce_function_bip340,(void *)0x0);
      if (iVar7 == 0) goto LAB_00144f27;
      iVar7 = secp256k1_schnorrsig_verify(CTX,local_228,local_358,0x20,&local_398);
      if (iVar7 == 0) goto LAB_00144f2c;
      secp256k1_scalar_set_b32(&local_2f8,local_228 + 0x20,(int *)0x0);
      secp256k1_scalar_negate(&local_2f8,&local_2f8);
      secp256k1_scalar_get_b32(local_228 + 0x20,&local_2f8);
      iVar7 = secp256k1_schnorrsig_verify(CTX,local_228,local_358,0x20,&local_398);
      if (iVar7 != 0) goto LAB_00144f31;
      iVar7 = secp256k1_schnorrsig_sign_custom
                        (CTX,local_228,(uchar *)0x0,0,&local_288,
                         (secp256k1_schnorrsig_extraparams *)0x0);
      if (iVar7 == 0) goto LAB_00144f36;
      iVar7 = secp256k1_schnorrsig_verify(CTX,local_228,(uchar *)0x0,0,&local_398);
      if (iVar7 == 0) goto LAB_00144f3b;
      uVar1 = secp256k1_testrand_int(0x100);
      uVar6 = 0xffffffffffffffe0;
      do {
        secp256k1_testrand256(local_168 + uVar6 + 0x20);
        uVar6 = uVar6 + 0x20;
      } while (uVar6 < 0xe0);
      iVar7 = secp256k1_schnorrsig_sign_custom
                        (CTX,local_228,local_168,(ulong)uVar1,&local_288,
                         (secp256k1_schnorrsig_extraparams *)0x0);
      if (iVar7 == 0) goto LAB_00144f40;
      iVar7 = secp256k1_schnorrsig_verify(CTX,local_228,local_168,(ulong)uVar1,&local_398);
      if (iVar7 == 0) goto LAB_00144f45;
      iVar7 = secp256k1_schnorrsig_verify
                        (CTX,local_228,local_168,(ulong)(uVar1 - 1 & 0xff),&local_398);
      if (iVar7 != 0) goto LAB_00144f4a;
      uVar4 = (int)local_290 + 1;
      local_290 = (ulong)uVar4;
      if (COUNT <= (int)uVar4) goto LAB_00144c7b;
    }
LAB_00144ea5:
    run_schnorrsig_tests_cold_91();
LAB_00144eaa:
    run_schnorrsig_tests_cold_90();
LAB_00144eaf:
    run_schnorrsig_tests_cold_89();
LAB_00144eb4:
    run_schnorrsig_tests_cold_88();
LAB_00144eb9:
    run_schnorrsig_tests_cold_87();
LAB_00144ebe:
    run_schnorrsig_tests_cold_44();
LAB_00144ec3:
    run_schnorrsig_tests_cold_86();
LAB_00144ec8:
    run_schnorrsig_tests_cold_85();
LAB_00144ecd:
    run_schnorrsig_tests_cold_45();
LAB_00144ed2:
    run_schnorrsig_tests_cold_46();
LAB_00144ed7:
    run_schnorrsig_tests_cold_47();
LAB_00144edc:
    run_schnorrsig_tests_cold_48();
LAB_00144ee1:
    run_schnorrsig_tests_cold_84();
LAB_00144ee6:
    run_schnorrsig_tests_cold_83();
LAB_00144eeb:
    run_schnorrsig_tests_cold_82();
LAB_00144ef0:
    run_schnorrsig_tests_cold_81();
LAB_00144ef5:
    run_schnorrsig_tests_cold_49();
LAB_00144efa:
    run_schnorrsig_tests_cold_80();
LAB_00144eff:
    run_schnorrsig_tests_cold_79();
LAB_00144f04:
    run_schnorrsig_tests_cold_50();
LAB_00144f09:
    run_schnorrsig_tests_cold_51();
LAB_00144f0e:
    run_schnorrsig_tests_cold_52();
LAB_00144f13:
    run_schnorrsig_tests_cold_76();
LAB_00144f18:
    run_schnorrsig_tests_cold_75();
LAB_00144f1d:
    run_schnorrsig_tests_cold_74();
LAB_00144f22:
    run_schnorrsig_tests_cold_53();
LAB_00144f27:
    run_schnorrsig_tests_cold_73();
LAB_00144f2c:
    run_schnorrsig_tests_cold_72();
LAB_00144f31:
    run_schnorrsig_tests_cold_54();
LAB_00144f36:
    run_schnorrsig_tests_cold_71();
LAB_00144f3b:
    run_schnorrsig_tests_cold_70();
LAB_00144f40:
    run_schnorrsig_tests_cold_69();
LAB_00144f45:
    run_schnorrsig_tests_cold_68();
LAB_00144f4a:
    run_schnorrsig_tests_cold_55();
LAB_00144f4f:
    run_schnorrsig_tests_cold_111();
LAB_00144f54:
    run_schnorrsig_tests_cold_110();
LAB_00144f59:
    run_schnorrsig_tests_cold_105();
LAB_00144f5e:
    run_schnorrsig_tests_cold_104();
LAB_00144f63:
    run_schnorrsig_tests_cold_1();
LAB_00144f68:
    run_schnorrsig_tests_cold_2();
  } while( true );
LAB_00144c7b:
  secp256k1_testrand256(local_398.data);
  psVar9 = CTX;
  iVar7 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)local_168,local_398.data);
  if (iVar7 == 0) {
LAB_001450d0:
    run_schnorrsig_tests_cold_67();
LAB_001450d5:
    run_schnorrsig_tests_cold_66();
LAB_001450da:
    run_schnorrsig_tests_cold_65();
LAB_001450df:
    run_schnorrsig_tests_cold_56();
LAB_001450e4:
    run_schnorrsig_tests_cold_64();
LAB_001450e9:
    run_schnorrsig_tests_cold_63();
LAB_001450ee:
    run_schnorrsig_tests_cold_62();
LAB_001450f3:
    run_schnorrsig_tests_cold_61();
LAB_001450f8:
    run_schnorrsig_tests_cold_60();
LAB_001450fd:
    run_schnorrsig_tests_cold_59();
  }
  else {
    psVar9 = CTX;
    iVar7 = secp256k1_keypair_xonly_pub
                      (CTX,(secp256k1_xonly_pubkey *)local_228,(int *)0x0,
                       (secp256k1_keypair *)local_168);
    if (iVar7 == 0) goto LAB_001450d5;
    psVar9 = CTX;
    iVar7 = secp256k1_xonly_pubkey_serialize(CTX,local_2d8,(secp256k1_xonly_pubkey *)local_228);
    if (iVar7 == 0) goto LAB_001450da;
    psVar9 = CTX;
    iVar7 = secp256k1_keypair_xonly_tweak_add(CTX,(secp256k1_keypair *)local_168,local_2d8);
    if (iVar7 != 1) goto LAB_001450df;
    psVar9 = CTX;
    iVar7 = secp256k1_keypair_xonly_pub
                      (CTX,(secp256k1_xonly_pubkey *)local_358,(int *)&local_3b8,
                       (secp256k1_keypair *)local_168);
    if (iVar7 == 0) goto LAB_001450e4;
    psVar9 = CTX;
    iVar7 = secp256k1_xonly_pubkey_serialize
                      (CTX,(uchar *)&local_2f8,(secp256k1_xonly_pubkey *)local_358);
    if (iVar7 == 0) goto LAB_001450e9;
    secp256k1_testrand256(local_3d8.magic);
    psVar9 = CTX;
    iVar7 = secp256k1_schnorrsig_sign_internal
                      (CTX,local_288.data,local_3d8.magic,0x20,(secp256k1_keypair *)local_168,
                       nonce_function_bip340,(void *)0x0);
    if (iVar7 == 0) goto LAB_001450ee;
    psVar9 = CTX;
    iVar7 = secp256k1_xonly_pubkey_parse
                      (CTX,(secp256k1_xonly_pubkey *)local_358,(uchar *)&local_2f8);
    if (iVar7 == 0) goto LAB_001450f3;
    psVar9 = CTX;
    iVar7 = secp256k1_schnorrsig_verify
                      (CTX,local_288.data,local_3d8.magic,0x20,(secp256k1_xonly_pubkey *)local_358);
    if (iVar7 == 0) goto LAB_001450f8;
    psVar9 = CTX;
    iVar7 = secp256k1_xonly_pubkey_serialize(CTX,local_2b8,(secp256k1_xonly_pubkey *)local_228);
    if (iVar7 == 0) goto LAB_001450fd;
    psVar9 = CTX;
    iVar7 = secp256k1_xonly_pubkey_parse(CTX,(secp256k1_xonly_pubkey *)local_228,local_2b8);
    if (iVar7 != 0) {
      psVar9 = CTX;
      iVar7 = secp256k1_xonly_pubkey_tweak_add_check
                        (CTX,(uchar *)&local_2f8,(int)local_3b8.magic,
                         (secp256k1_xonly_pubkey *)local_228,local_2d8);
      if (iVar7 != 0) {
        return;
      }
      goto LAB_00145107;
    }
  }
  run_schnorrsig_tests_cold_58();
LAB_00145107:
  run_schnorrsig_tests_cold_57();
  *(undefined4 *)((psVar9->ecmult_gen_ctx).initial.z.n + 1) = 0;
  (psVar9->ecmult_gen_ctx).initial.x.n[0] = 0x100000000;
  *(undefined8 *)&psVar9->ecmult_gen_ctx = 0;
  (psVar9->ecmult_gen_ctx).blind.d[0] = 0;
  (psVar9->ecmult_gen_ctx).blind.d[1] = 0;
  (psVar9->ecmult_gen_ctx).blind.d[2] = 0;
  (psVar9->ecmult_gen_ctx).blind.d[3] = 0;
  secp256k1_fe_verify((secp256k1_fe *)psVar9);
  (psVar9->ecmult_gen_ctx).initial.y.n[0] = 0x100000000;
  (psVar9->ecmult_gen_ctx).initial.x.n[1] = 0;
  (psVar9->ecmult_gen_ctx).initial.x.n[2] = 0;
  (psVar9->ecmult_gen_ctx).initial.x.n[3] = 0;
  (psVar9->ecmult_gen_ctx).initial.x.n[4] = 0;
  (psVar9->ecmult_gen_ctx).initial.x.magnitude = 0;
  (psVar9->ecmult_gen_ctx).initial.x.normalized = 0;
  secp256k1_fe_verify((secp256k1_fe *)((psVar9->ecmult_gen_ctx).initial.x.n + 1));
  (psVar9->ecmult_gen_ctx).initial.z.n[0] = 0x100000000;
  (psVar9->ecmult_gen_ctx).initial.y.n[1] = 0;
  (psVar9->ecmult_gen_ctx).initial.y.n[2] = 0;
  (psVar9->ecmult_gen_ctx).initial.y.n[3] = 0;
  (psVar9->ecmult_gen_ctx).initial.y.n[4] = 0;
  (psVar9->ecmult_gen_ctx).initial.y.magnitude = 0;
  (psVar9->ecmult_gen_ctx).initial.y.normalized = 0;
  secp256k1_fe_verify((secp256k1_fe *)((psVar9->ecmult_gen_ctx).initial.y.n + 1));
  return;
}

Assistant:

static void run_schnorrsig_tests(void) {
    int i;
    run_nonce_function_bip340_tests();

    test_schnorrsig_api();
    test_schnorrsig_sha256_tagged();
    test_schnorrsig_bip_vectors();
    for (i = 0; i < COUNT; i++) {
        test_schnorrsig_sign();
        test_schnorrsig_sign_verify();
    }
    test_schnorrsig_taproot();
}